

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O3

void __thiscall
txpackage_tests::package_witness_swap_tests::test_method(package_witness_swap_tests *this)

{
  CScript *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  CKey input_signing_key_02;
  CKey input_signing_key_03;
  CScript output_destination;
  CScript output_destination_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  pointer pCVar17;
  undefined1 uVar18;
  Chainstate *pCVar19;
  int64_t iVar20;
  CAmount CVar21;
  const_iterator cVar22;
  const_iterator cVar23;
  const_iterator cVar24;
  const_iterator cVar25;
  int64_t iVar26;
  uint uVar27;
  _Base_ptr p_Var28;
  undefined8 uVar29;
  long lVar30;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar31;
  _Storage<CFeeRate,_true> _Var32;
  iterator pvVar33;
  CTxMemPool *pCVar34;
  iterator pvVar35;
  optional<CFeeRate> *poVar36;
  _Storage<CFeeRate,_true> *p_Var37;
  long in_FS_OFFSET;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  initializer_list<transaction_identifier<true>_> __l_06;
  const_string file_25;
  const_string file_26;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef input_transaction_02;
  CTransactionRef input_transaction_03;
  CTransactionRef ptx_mixed_child;
  CTransactionRef ptx_parent3;
  CMutableTransaction mtx_parent3;
  CTransactionRef ptx_parent2_v2;
  CTransactionRef ptx_parent2_v1;
  CMutableTransaction mtx_parent2_v2;
  CMutableTransaction mtx_parent2_v1;
  CTransactionRef ptx_grandparent2;
  CMutableTransaction mtx_grandparent2;
  CScriptWitness parent2_witness2;
  CScriptWitness parent2_witness1;
  CTransactionRef ptx_parent1;
  CScriptWitness acs_witness;
  Package package_mixed;
  CTransactionRef ptx_grandchild;
  CTransactionRef ptx_child2;
  CTransactionRef ptx_child1;
  CMutableTransaction mtx_child2;
  CMutableTransaction mtx_child1;
  CScriptWitness witness2;
  CScriptWitness witness1;
  CTransactionRef ptx_parent;
  CMutableTransaction mtx_parent;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  expected_wtxids;
  CFeeRate expected_feerate;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_mixed;
  CMutableTransaction mtx_mixed_child;
  MempoolAcceptResult parent2_v2_result;
  CMutableTransaction mtx_parent1;
  CMutableTransaction mtx_grandchild;
  PackageMempoolAcceptResult submit_segwit_dedup;
  PackageMempoolAcceptResult submit_witness2;
  check_type cVar57;
  char *pcVar54;
  undefined4 in_stack_fffffffffffff1ec;
  _Sp_alloc_shared_tag<std::allocator<CTransaction>_> __a;
  undefined4 uVar55;
  undefined8 in_stack_fffffffffffff1f0;
  char *pcVar56;
  undefined8 in_stack_fffffffffffff1f8;
  assertion_result *ar;
  undefined8 in_stack_fffffffffffff200;
  CKey *other;
  undefined8 in_stack_fffffffffffff210;
  char *local_de8;
  char *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  char *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  char *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  _Storage<CFeeRate,_true> local_d28;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_d20;
  char *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  value_type local_bf8;
  undefined1 local_be8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_be0;
  char *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  undefined1 *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  value_type local_b78;
  undefined1 local_b68 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_b60;
  element_type *local_b58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b50;
  _Storage<CFeeRate,_true> local_b48;
  char *local_b40;
  vector<CTxOut,_std::allocator<CTxOut>_> local_b30;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  CTransactionRef local_ae0;
  value_type local_ad0;
  CMutableTransaction local_ac0;
  undefined1 local_a88 [16];
  shared_count sStack_a78;
  vector<CTxOut,_std::allocator<CTxOut>_> local_a70;
  uint32_t local_a58;
  uint32_t uStack_a54;
  CTransaction *local_a50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a48;
  undefined1 local_a40 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_a38;
  element_type *local_a30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a28;
  _Storage<CFeeRate,_true> local_a20;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_a18;
  vector<CTxOut,_std::allocator<CTxOut>_> local_a08;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_9e8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_9c8;
  value_type local_9a8;
  undefined1 local_998 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_990;
  element_type *local_988;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_980;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_978;
  undefined1 local_958 [16];
  pointer local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  shared_count local_880;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_878;
  undefined1 local_870 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_868;
  CTransaction *local_860;
  _Storage<CFeeRate,_true> *local_858;
  undefined1 local_850 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  shared_count local_650;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_648;
  _Storage<CFeeRate,_true> local_640;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_638;
  CMutableTransaction local_630;
  CMutableTransaction local_5f8;
  undefined1 local_5c0 [8];
  secure_unique_ptr<KeyType> local_5b8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_5b0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_598;
  _Storage<CFeeRate,_true> local_578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_570;
  undefined1 local_568 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_560;
  element_type *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_550;
  CMutableTransaction local_548;
  _Base_ptr *local_510;
  _Storage<CFeeRate,_true> local_508;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_500;
  _Base_ptr **local_4f0;
  _Storage<CFeeRate,_true> local_4e8;
  CFeeRate local_4e0;
  char *local_4d8;
  _Storage<CFeeRate,_true> local_4d0;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_4c8;
  unique_lock<std::recursive_mutex> local_4b8;
  _Storage<CFeeRate,_true> local_4a8 [2];
  long local_498 [2];
  char local_488;
  _Storage<CFeeRate,_true> local_480;
  element_type *peStack_478;
  undefined4 local_470;
  vector<CTxOut,_std::allocator<CTxOut>_> local_468;
  direct_or_indirect local_448;
  uint local_42c;
  undefined1 local_428 [28];
  uint local_40c;
  undefined1 local_408 [16];
  _Storage<CFeeRate,_true> local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [80];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_370;
  bool local_358;
  direct_or_indirect local_328;
  uint local_30c;
  direct_or_indirect local_308;
  uint local_2ec;
  direct_or_indirect local_2e8;
  uint local_2cc;
  undefined1 local_2c8 [28];
  uint local_2ac;
  undefined1 local_2a8 [16];
  shared_count sStack_298;
  vector<CTxOut,_std::allocator<CTxOut>_> local_290;
  direct_or_indirect local_270;
  uint local_254;
  direct_or_indirect local_250;
  uint local_234;
  undefined1 local_230 [28];
  uint local_214;
  undefined1 local_210 [16];
  shared_count sStack_200;
  undefined1 local_1f8 [8];
  bool local_1f0;
  direct_or_indirect local_1d8;
  uint local_1bc;
  _Storage<CFeeRate,_true> local_1b8;
  undefined1 auStack_1b0 [2];
  uchar uStack_1ae;
  uchar uStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  uchar uStack_1a9;
  shared_count local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_190;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_170;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  _Storage<CFeeRate,_true> local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_f0;
  direct_or_indirect local_b8;
  uint local_9c;
  direct_or_indirect local_98;
  uint local_7c;
  direct_or_indirect local_78;
  uint local_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  sStack_298.pi_ = (sp_counted_base *)local_2a8._8_8_;
  local_408._8_8_ = local_408._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks((TestChain100Setup *)this,5);
  local_408._0_8_ = 5000;
  TestChain100Setup::MockMempoolMinFee((TestChain100Setup *)this,(CFeeRate *)local_408);
  local_4b8._M_device = &cs_main.super_recursive_mutex;
  local_4b8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_4b8);
  _local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_138[0] = (class_property<bool>)0x75;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408,(iterator)local_408,
             local_138);
  uVar55 = _Stack_3f0._M_pi._4_4_ - 0x1d;
  if ((uint)_Stack_3f0._M_pi._4_4_ < 0x1d) {
    uVar55 = _Stack_3f0._M_pi._4_4_;
  }
  ppVar31 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408._0_8_;
  if ((uint)_Stack_3f0._M_pi._4_4_ < 0x1d) {
    ppVar31 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408;
  }
  local_138[0] = 'Q';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408,
             (uchar *)((long)&ppVar31->_union + (long)(int)uVar55),local_138);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408);
  if (0x1c < (uint)_Stack_3f0._M_pi._4_4_) {
    free((void *)local_408._0_8_);
  }
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)local_138,(CScript *)&local_58.indirect_contents);
  _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aaStack_120[0]._0_8_;
  local_3f8 = local_128;
  local_408._8_8_ = local_138._8_8_;
  local_408._0_8_ = local_138._0_8_;
  local_3c0[0] = '\x04';
  GetScriptForDestination((CScript *)&local_78.indirect_contents,(CTxDestination *)local_408);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_408);
  psVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_558 = (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_550 = (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_550->_M_use_count = local_550->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_550->_M_use_count = local_550->_M_use_count + 1;
    }
  }
  other = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey;
  CKey::CKey((CKey *)local_568,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents);
  pvVar33 = local_568;
  pvVar35 = (iterator)0x0;
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key._0_8_ = &local_98;
  auVar14._4_8_ = in_stack_fffffffffffff1f0;
  auVar14._0_4_ = in_stack_fffffffffffff1ec;
  auVar14._12_8_ = in_stack_fffffffffffff1f8;
  auVar14._20_8_ = in_stack_fffffffffffff200;
  auVar14._28_4_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_558;
  TestChain100Setup::CreateValidMempoolTransaction
            (&local_548,(TestChain100Setup *)this,input_transaction,0,(int)pvVar33,input_signing_key
             ,(CScript)(auVar14 << 0x20),(CAmount)other,SUB81(in_stack_fffffffffffff210,0));
  if (0x1c < local_7c) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_560._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_560,
               local_560._M_head_impl);
  }
  local_560._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550);
  }
  local_578 = (_Storage<CFeeRate,_true>)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_570,(CTransaction **)&local_578,(allocator<CTransaction> *)local_408,&local_548)
  ;
  local_598.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._0_4_ = 1;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&local_598,(int *)local_408);
  uVar29 = local_58.indirect_contents.indirect;
  if (local_3c < 0x1d) {
    uVar29 = &local_58;
  }
  local_408._0_8_ = uVar29;
  uVar27 = local_3c - 0x1d;
  if (local_3c < 0x1d) {
    uVar27 = local_3c;
  }
  local_138._0_8_ =
       (long)&((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar29)->indirect
              )->_union + (long)(int)uVar27;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_598,(iterator *)local_408,(iterator *)local_138);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&local_5b0,&local_598);
  local_408._0_4_ = 2;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&local_5b0,(int *)local_408);
  uVar29 = &local_58;
  if (0x1c < local_3c) {
    uVar29 = local_58.indirect_contents.indirect;
  }
  uVar27 = local_3c - 0x1d;
  if (0x1c >= local_3c) {
    uVar27 = local_3c;
  }
  local_138._0_8_ =
       (long)&((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar29)->indirect
              )->_union + (long)(int)uVar27;
  local_408._0_8_ = uVar29;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_5b0,(iterator *)local_408,(iterator *)local_138);
  GenerateRandomKey(SUB81((CKey *)local_5c0,0));
  CKey::GetPubKey((CPubKey *)local_138,(CKey *)local_5c0);
  ar = (assertion_result *)local_138;
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_1b8._M_value,(CPubKey *)ar);
  local_3f8._M_value.nSatoshisPerK._0_4_ = local_1a8.pi_._0_4_;
  local_408._8_8_ = _auStack_1b0;
  local_408._0_8_ = local_1b8;
  local_3c0[0] = '\x05';
  GetScriptForDestination((CScript *)&local_b8.indirect_contents,(CTxDestination *)local_408);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_408);
  CMutableTransaction::CMutableTransaction(&local_5f8);
  local_5f8.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_5f8.vin,1);
  pCVar17 = local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar29 = *(undefined8 *)((long)local_578 + 0x39);
  uVar5 = *(undefined8 *)((long)local_578 + 0x41);
  uVar6 = *(undefined8 *)((long)local_578 + 0x51);
  *(undefined8 *)
   (((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = *(undefined8 *)((long)local_578 + 0x49);
  *(undefined8 *)
   (((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uVar6;
  *(undefined8 *)
   ((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar29;
  *(undefined8 *)
   (((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = uVar5;
  ((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  pCVar1 = &(local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->scriptSig;
  if (0x1c < ((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase._size) {
    free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(undefined1 (*) [16])((long)&(pCVar17->scriptSig).super_CScriptBase._union + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(pCVar1->super_CScriptBase)._union = (undefined1  [16])0x0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((local_5f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&local_598);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_5f8.vout,1);
  (local_5f8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 4800000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_5f8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&local_630.vin,&local_5f8.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_630.vout,&local_5f8.vout);
  local_630.nLockTime = local_5f8.nLockTime;
  local_630.version = local_5f8.version;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((local_630.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&local_5b0);
  local_640 = (_Storage<CFeeRate,_true>)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_638,(CTransaction **)&local_640,(allocator<CTransaction> *)local_408,&local_5f8)
  ;
  local_650.pi_ = (sp_counted_base *)0x0;
  __a._M_a = (allocator<CTransaction> *)local_408;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_648,(CTransaction **)&local_650,__a,&local_630);
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x21f;
  file.m_begin = (iterator)&local_660;
  msg.m_end = pvVar33;
  msg.m_begin = pvVar35;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_670,msg);
  _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(stack0xfffffffffffffe51 << 8);
  local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01388f08;
  local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  aStack_1a0._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  auVar44 = *(undefined1 (*) [16])((long)local_640 + 0x49);
  auVar46[0] = -(*(undefined1 *)((long)&local_650.pi_[3].use_count_ + 1) ==
                *(char *)((long)local_640 + 0x39));
  auVar46[1] = -(*(undefined1 *)((long)&local_650.pi_[3].use_count_ + 2) ==
                *(char *)((long)local_640 + 0x3a));
  auVar46[2] = -(*(undefined1 *)((long)&local_650.pi_[3].use_count_ + 3) ==
                *(char *)((long)local_640 + 0x3b));
  auVar46[3] = -((char)local_650.pi_[3].weak_count_ == *(char *)((long)local_640 + 0x3c));
  auVar46[4] = -(*(undefined1 *)((long)&local_650.pi_[3].weak_count_ + 1) ==
                *(char *)((long)local_640 + 0x3d));
  auVar46[5] = -(*(undefined1 *)((long)&local_650.pi_[3].weak_count_ + 2) ==
                *(char *)((long)local_640 + 0x3e));
  auVar46[6] = -(*(undefined1 *)((long)&local_650.pi_[3].weak_count_ + 3) ==
                *(char *)((long)local_640 + 0x3f));
  auVar46[7] = -(*(char *)&local_650.pi_[4]._vptr_sp_counted_base ==
                *(char *)((long)local_640 + 0x40));
  auVar46[8] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 1) ==
                *(char *)((long)local_640 + 0x41));
  auVar46[9] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 2) ==
                *(char *)((long)local_640 + 0x42));
  auVar46[10] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 3) ==
                 *(char *)((long)local_640 + 0x43));
  auVar46[0xb] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 4) ==
                  *(char *)((long)local_640 + 0x44));
  auVar46[0xc] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 5) ==
                  *(char *)((long)local_640 + 0x45));
  auVar46[0xd] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 6) ==
                  *(char *)((long)local_640 + 0x46));
  auVar46[0xe] = -(*(undefined1 *)((long)&local_650.pi_[4]._vptr_sp_counted_base + 7) ==
                  *(char *)((long)local_640 + 0x47));
  auVar46[0xf] = -((char)local_650.pi_[4].use_count_ == *(char *)((long)local_640 + 0x48));
  auVar38[0] = -(*(undefined1 *)((long)&local_650.pi_[4].use_count_ + 1) == auVar44[0]);
  auVar38[1] = -(*(undefined1 *)((long)&local_650.pi_[4].use_count_ + 2) == auVar44[1]);
  auVar38[2] = -(*(undefined1 *)((long)&local_650.pi_[4].use_count_ + 3) == auVar44[2]);
  auVar38[3] = -((char)local_650.pi_[4].weak_count_ == auVar44[3]);
  auVar38[4] = -(*(undefined1 *)((long)&local_650.pi_[4].weak_count_ + 1) == auVar44[4]);
  auVar38[5] = -(*(undefined1 *)((long)&local_650.pi_[4].weak_count_ + 2) == auVar44[5]);
  auVar38[6] = -(*(undefined1 *)((long)&local_650.pi_[4].weak_count_ + 3) == auVar44[6]);
  auVar38[7] = -(*(char *)&local_650.pi_[5]._vptr_sp_counted_base == auVar44[7]);
  auVar38[8] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 1) == auVar44[8]);
  auVar38[9] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 2) == auVar44[9]);
  auVar38[10] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 3) == auVar44[10])
  ;
  auVar38[0xb] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 4) ==
                  auVar44[0xb]);
  auVar38[0xc] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 5) ==
                  auVar44[0xc]);
  auVar38[0xd] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 6) ==
                  auVar44[0xd]);
  auVar38[0xe] = -(*(undefined1 *)((long)&local_650.pi_[5]._vptr_sp_counted_base + 7) ==
                  auVar44[0xe]);
  auVar38[0xf] = -((char)local_650.pi_[5].use_count_ == auVar44[0xf]);
  auVar38 = auVar38 & auVar46;
  local_210[0] = (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) == 0xffff;
  local_a20 = (_Storage<CFeeRate,_true>)((long)local_640 + 0x39);
  local_a88._0_8_ = (long)&local_650.pi_[3].use_count_ + 1;
  local_210._8_8_ = (element_type *)0x0;
  sStack_200.pi_ = (sp_counted_base *)0x0;
  local_2a8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_2a8._8_8_ = (element_type *)0xf4389f;
  _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a20;
  local_408[8] = 0;
  local_408._0_8_ = &PTR__lazy_ostream_01389af8;
  local_3f8 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::inst;
  aaStack_120[0]._0_8_ = local_a88;
  local_138._8_8_ = stack0xfffffffffffffed1 << 8;
  local_138._0_8_ = &PTR__lazy_ostream_01389af8;
  local_128 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::inst;
  pcVar56 = "ptx_child2->GetHash()";
  pcVar54 = "ptx_child1->GetHash()";
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_210,(lazy_ostream *)&local_1b8._M_value,1,2,REQUIRE,0xf44d9f,
             (size_t)local_2a8,0x21f,(int)__a._M_a);
  boost::detail::shared_count::~shared_count(&sStack_200);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x221;
  file_00.m_begin = (iterator)&local_680;
  msg_00.m_end = pvVar35;
  msg_00.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_690,
             msg_00);
  auVar44 = *(undefined1 (*) [16])((long)local_640 + 0x69);
  auVar47[0] = -(*(undefined1 *)((long)&local_650.pi_[5].use_count_ + 1) ==
                *(char *)((long)local_640 + 0x59));
  auVar47[1] = -(*(undefined1 *)((long)&local_650.pi_[5].use_count_ + 2) ==
                *(char *)((long)local_640 + 0x5a));
  auVar47[2] = -(*(undefined1 *)((long)&local_650.pi_[5].use_count_ + 3) ==
                *(char *)((long)local_640 + 0x5b));
  auVar47[3] = -((char)local_650.pi_[5].weak_count_ == *(char *)((long)local_640 + 0x5c));
  auVar47[4] = -(*(undefined1 *)((long)&local_650.pi_[5].weak_count_ + 1) ==
                *(char *)((long)local_640 + 0x5d));
  auVar47[5] = -(*(undefined1 *)((long)&local_650.pi_[5].weak_count_ + 2) ==
                *(char *)((long)local_640 + 0x5e));
  auVar47[6] = -(*(undefined1 *)((long)&local_650.pi_[5].weak_count_ + 3) ==
                *(char *)((long)local_640 + 0x5f));
  auVar47[7] = -(*(char *)&local_650.pi_[6]._vptr_sp_counted_base ==
                *(char *)((long)local_640 + 0x60));
  auVar47[8] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 1) ==
                *(char *)((long)local_640 + 0x61));
  auVar47[9] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 2) ==
                *(char *)((long)local_640 + 0x62));
  auVar47[10] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 3) ==
                 *(char *)((long)local_640 + 99));
  auVar47[0xb] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 4) ==
                  *(char *)((long)local_640 + 100));
  auVar47[0xc] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 5) ==
                  *(char *)((long)local_640 + 0x65));
  auVar47[0xd] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 6) ==
                  *(char *)((long)local_640 + 0x66));
  auVar47[0xe] = -(*(undefined1 *)((long)&local_650.pi_[6]._vptr_sp_counted_base + 7) ==
                  *(char *)((long)local_640 + 0x67));
  auVar47[0xf] = -((char)local_650.pi_[6].use_count_ == *(char *)((long)local_640 + 0x68));
  auVar39[0] = -(*(undefined1 *)((long)&local_650.pi_[6].use_count_ + 1) == auVar44[0]);
  auVar39[1] = -(*(undefined1 *)((long)&local_650.pi_[6].use_count_ + 2) == auVar44[1]);
  auVar39[2] = -(*(undefined1 *)((long)&local_650.pi_[6].use_count_ + 3) == auVar44[2]);
  auVar39[3] = -((char)local_650.pi_[6].weak_count_ == auVar44[3]);
  auVar39[4] = -(*(undefined1 *)((long)&local_650.pi_[6].weak_count_ + 1) == auVar44[4]);
  auVar39[5] = -(*(undefined1 *)((long)&local_650.pi_[6].weak_count_ + 2) == auVar44[5]);
  auVar39[6] = -(*(undefined1 *)((long)&local_650.pi_[6].weak_count_ + 3) == auVar44[6]);
  auVar39[7] = -(*(char *)&local_650.pi_[7]._vptr_sp_counted_base == auVar44[7]);
  auVar39[8] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 1) == auVar44[8]);
  auVar39[9] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 2) == auVar44[9]);
  auVar39[10] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 3) == auVar44[10])
  ;
  auVar39[0xb] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 4) ==
                  auVar44[0xb]);
  auVar39[0xc] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 5) ==
                  auVar44[0xc]);
  auVar39[0xd] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 6) ==
                  auVar44[0xd]);
  auVar39[0xe] = -(*(undefined1 *)((long)&local_650.pi_[7]._vptr_sp_counted_base + 7) ==
                  auVar44[0xe]);
  auVar39[0xf] = -((char)local_650.pi_[7].use_count_ == auVar44[0xf]);
  auVar39 = auVar39 & auVar47;
  local_138[0] = (ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff;
  local_138._8_8_ = (element_type *)0x0;
  local_128 = (_Storage<CFeeRate,_true>)0x0;
  local_1b8 = (_Storage<CFeeRate,_true>)0xf44dcb;
  _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)"";
  local_408[8] = 0;
  local_408._0_8_ = &PTR__lazy_ostream_01389048;
  _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_1b8;
  local_3f8 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_698 = "";
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_138,(lazy_ostream *)local_408,1,0,WARN,(check_type)pcVar54,
             (size_t)&local_6a0,0x221);
  boost::detail::shared_count::~shared_count((shared_count *)&local_128._M_value);
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x223;
  file_01.m_begin = (iterator)&local_6b0;
  msg_01.m_end = pvVar35;
  msg_01.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_6c0,
             msg_01);
  local_138._0_8_ = local_578;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
    }
  }
  local_128 = local_640;
  local_138._8_8_ = local_570._M_pi;
  aaStack_120[0]._M_allocated_capacity = local_638._M_pi;
  if ((_Storage<CFeeRate,_true> *)local_638._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_638._M_pi)->_M_use_count = (local_638._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_638._M_pi)->_M_use_count = (local_638._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)local_138;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_a88,__l,(allocator_type *)&local_480._M_value);
  GetPackageHash((uint256 *)local_408,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)local_a88);
  local_210._0_8_ = local_578;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
    }
  }
  sStack_200.pi_ = local_650.pi_;
  local_210._8_8_ = local_570._M_pi;
  local_1f8 = (undefined1  [8])local_648._M_pi;
  if ((_Storage<CFeeRate,_true> *)local_648._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
    }
  }
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_210;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_ac0,__l_00,(allocator_type *)&local_4a8[0]._M_value);
  GetPackageHash((uint256 *)&local_1b8._M_value,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_ac0);
  auVar44[0] = -(local_1b8._M_value.nSatoshisPerK._0_1_ == local_408[0]);
  auVar44[1] = -(local_1b8._M_value.nSatoshisPerK._1_1_ == local_408[1]);
  auVar44[2] = -(local_1b8._M_value.nSatoshisPerK._2_1_ == local_408[2]);
  auVar44[3] = -(local_1b8._M_value.nSatoshisPerK._3_1_ == local_408[3]);
  auVar44[4] = -(local_1b8._M_value.nSatoshisPerK._4_1_ == local_408[4]);
  auVar44[5] = -(local_1b8._M_value.nSatoshisPerK._5_1_ == local_408[5]);
  auVar44[6] = -(local_1b8._M_value.nSatoshisPerK._6_1_ == local_408[6]);
  auVar44[7] = -(local_1b8._M_value.nSatoshisPerK._7_1_ == local_408[7]);
  auVar44[8] = -(auStack_1b0[0] == local_408[8]);
  auVar44[9] = -(auStack_1b0[1] == local_408[9]);
  auVar44[10] = -(uStack_1ae == local_408[10]);
  auVar44[0xb] = -(uStack_1ad == local_408[0xb]);
  auVar44[0xc] = -(uStack_1ac == local_408[0xc]);
  auVar44[0xd] = -(uStack_1ab == local_408[0xd]);
  auVar44[0xe] = -(uStack_1aa == local_408[0xe]);
  auVar44[0xf] = -(uStack_1a9 == local_408[0xf]);
  auVar48[0] = -((uchar)local_1a8.pi_ == local_3f8._M_value.nSatoshisPerK._0_1_);
  auVar48[1] = -(local_1a8.pi_._1_1_ == local_3f8._M_value.nSatoshisPerK._1_1_);
  auVar48[2] = -(local_1a8.pi_._2_1_ == local_3f8._M_value.nSatoshisPerK._2_1_);
  auVar48[3] = -(local_1a8.pi_._3_1_ == local_3f8._M_value.nSatoshisPerK._3_1_);
  auVar48[4] = -(local_1a8.pi_._4_1_ == local_3f8._M_value.nSatoshisPerK._4_1_);
  auVar48[5] = -(local_1a8.pi_._5_1_ == local_3f8._M_value.nSatoshisPerK._5_1_);
  auVar48[6] = -(local_1a8.pi_._6_1_ == local_3f8._M_value.nSatoshisPerK._6_1_);
  auVar48[7] = -(local_1a8.pi_._7_1_ == local_3f8._M_value.nSatoshisPerK._7_1_);
  auVar48[8] = -(aStack_1a0._M_local_buf[0] == _Stack_3f0._M_pi._0_1_);
  auVar48[9] = -(aStack_1a0._M_local_buf[1] == _Stack_3f0._M_pi._1_1_);
  auVar48[10] = -(aStack_1a0._M_local_buf[2] == _Stack_3f0._M_pi._2_1_);
  auVar48[0xb] = -(aStack_1a0._M_local_buf[3] == _Stack_3f0._M_pi._3_1_);
  auVar48[0xc] = -(aStack_1a0._M_local_buf[4] == _Stack_3f0._M_pi._4_1_);
  auVar48[0xd] = -(aStack_1a0._M_local_buf[5] == _Stack_3f0._M_pi._5_1_);
  auVar48[0xe] = -(aStack_1a0._M_local_buf[6] == _Stack_3f0._M_pi._6_1_);
  auVar48[0xf] = -(aStack_1a0._M_local_buf[7] == _Stack_3f0._M_pi._7_1_);
  auVar44 = auVar44 & auVar48;
  local_a20._M_value.nSatoshisPerK._0_1_ =
       (ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) | (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) != 0xffff;
  local_a18.px = (element_type *)0x0;
  local_a18.pn.pi_ = (sp_counted_base *)0x0;
  local_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_b48;
  local_b48 = (_Storage<CFeeRate,_true>)0xf44e08;
  local_b40 = "";
  local_2a8._8_8_ = local_2a8._9_8_ << 8;
  local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
  sStack_298.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_6c8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a20._M_value,(lazy_ostream *)local_2a8,1,0,WARN,
             (check_type)pcVar54,(size_t)&local_6d0,0x223);
  boost::detail::shared_count::~shared_count(&local_a18.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_ac0);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_230 + lVar30 + 0x18) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_230 + lVar30 + 0x18));
    }
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_a88);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_140 + lVar30) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_140 + lVar30));
    }
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  local_408._8_8_ = local_570._M_pi;
  local_408._0_8_ = local_578;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3f0._M_pi = local_638._M_pi;
  local_3f8 = local_640;
  if ((_Storage<CFeeRate,_true> *)local_638._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_638._M_pi)->_M_use_count = (local_638._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_638._M_pi)->_M_use_count = (local_638._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_408;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_ac0,__l_01,(allocator_type *)local_138);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_428 + lVar30 + 0x18) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_428 + lVar30 + 0x18));
    }
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  poVar36 = (optional<CFeeRate> *)local_138;
  auVar9[0xf] = 0;
  auVar9._0_15_ = stack0xfffffffffffffed1;
  stack0xfffffffffffffed0 = auVar9 << 8;
  ProcessNewPackage((PackageMempoolAcceptResult *)local_408,pCVar19,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(Package *)&local_ac0,
                    false,poVar36);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((_Storage<CFeeRate,_true> *)local_138)->_M_value,(Package *)&local_ac0,
             (PackageMempoolAcceptResult *)local_408,true,pCVar34);
  if (aaStack_120[0]._M_local_buf[8] == 1) {
    local_6e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6d8 = "";
    local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x22c;
    file_02.m_begin = (iterator)&local_6e0;
    msg_02.m_end = (iterator)poVar36;
    msg_02.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6f0,
               msg_02);
    local_210._0_8_ = local_210._0_8_ & 0xffffffffffffff00;
    local_210._8_8_ = (element_type *)0x0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    if (aaStack_120[0]._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01388e08;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_700 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_6f8 = "";
    aStack_1a0._M_allocated_capacity = (size_type)(_Storage<CFeeRate,_true> *)local_138;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_210,(lazy_ostream *)&local_1b8._M_value,1,1,WARN,
               (check_type)pcVar54,(size_t)&local_700,0x22c);
    boost::detail::shared_count::~shared_count(&sStack_200);
  }
  if ((aaStack_120[0]._8_1_ & 1) != 0) {
    aaStack_120[0]._8_4_ = aaStack_120[0]._8_4_ & 0xffffff00;
    if ((_Storage<CFeeRate,_true> *)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)((long)local_128 + 1));
    }
  }
  local_138._0_8_ = local_578;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_570._M_pi)->_M_use_count = (local_570._M_pi)->_M_use_count + 1;
    }
  }
  local_128 = (_Storage<CFeeRate,_true>)local_650.pi_;
  local_138._8_8_ = local_570._M_pi;
  aaStack_120[0]._M_allocated_capacity = local_648._M_pi;
  if ((_Storage<CFeeRate,_true> *)local_648._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
    }
  }
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_138;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_b48._M_value,__l_02,(allocator_type *)&local_1b8._M_value);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_140 + lVar30) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_140 + lVar30));
    }
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  p_Var37 = &local_1b8;
  auVar10[0xf] = 0;
  auVar10._0_15_ = stack0xfffffffffffffe51;
  _auStack_1b0 = auVar10 << 8;
  ProcessNewPackage((PackageMempoolAcceptResult *)local_138,pCVar19,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
                    (Package *)&local_b48._M_value,false,(optional<CFeeRate> *)&p_Var37->_M_value);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1b8._M_value,(Package *)&local_b48._M_value,
             (PackageMempoolAcceptResult *)local_138,true,pCVar34);
  if (aStack_1a0._M_local_buf[8] == '\x01') {
    local_710 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_708 = "";
    local_720 = &boost::unit_test::basic_cstring<char_const>::null;
    local_718 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x234;
    file_03.m_begin = (iterator)&local_710;
    msg_03.m_end = (iterator)p_Var37;
    msg_03.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_720,
               msg_03);
    local_2a8._0_8_ = local_2a8._0_8_ & 0xffffffffffffff00;
    local_2a8._8_8_ = (element_type *)0x0;
    sStack_298.pi_ = (sp_counted_base *)0x0;
    if (aStack_1a0._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    local_210._8_8_ = local_210._9_8_ << 8;
    local_210._0_8_ = &PTR__lazy_ostream_01388e08;
    sStack_200.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_730 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_728 = "";
    local_1f8 = (undefined1  [8])&local_1b8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2a8,(lazy_ostream *)local_210,1,1,WARN,(check_type)pcVar54,
               (size_t)&local_730,0x234);
    boost::detail::shared_count::~shared_count(&sStack_298);
  }
  else {
    cVar22 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_f0,(key_type *)((long)local_578 + 0x59));
    cVar23 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_f0,(key_type *)((long)&local_650.pi_[5].use_count_ + 1));
    local_740 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_738 = "";
    local_750 = &boost::unit_test::basic_cstring<char_const>::null;
    local_748 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x238;
    file_04.m_begin = (iterator)&local_740;
    msg_04.m_end = (iterator)p_Var37;
    msg_04.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_750,
               msg_04);
    local_2a8._8_8_ = (element_type *)0x0;
    sStack_298.pi_ = (sp_counted_base *)0x0;
    local_a20 = (_Storage<CFeeRate,_true>)0xf44e5d;
    local_a18.px = (element_type *)0xf44eb7;
    local_210._8_8_ = local_210._9_8_ << 8;
    local_210._0_8_ = &PTR__lazy_ostream_01389048;
    sStack_200.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f8 = (undefined1  [8])&local_a20;
    local_760 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_758 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    local_2a8[0] = (class_property<bool>)(class_property<bool>)(cVar22._M_node[2]._M_color == 2);
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2a8,(lazy_ostream *)local_210,1,0,WARN,(check_type)pcVar54,
               (size_t)&local_760,0x238);
    boost::detail::shared_count::~shared_count(&sStack_298);
    local_770 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_768 = "";
    local_780 = &boost::unit_test::basic_cstring<char_const>::null;
    local_778 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x239;
    file_05.m_begin = (iterator)&local_770;
    msg_05.m_end = pvVar35;
    msg_05.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_780,
               msg_05);
    ar = (assertion_result *)local_2a8;
    local_2a8[0] = (class_property<bool>)(class_property<bool>)(cVar23._M_node[2]._M_color == 3);
    local_2a8._8_8_ = (element_type *)0x0;
    sStack_298.pi_ = (sp_counted_base *)0x0;
    local_a20 = (_Storage<CFeeRate,_true>)0xf44eb8;
    local_a18.px = (element_type *)0xf44f0d;
    __a._M_a = (allocator<CTransaction> *)local_210;
    local_210._8_8_ = local_210._9_8_ << 8;
    local_210._0_8_ = &PTR__lazy_ostream_01389048;
    sStack_200.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f8 = (undefined1  [8])&local_a20;
    local_790 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_788 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (ar,(lazy_ostream *)__a._M_a,1,0,WARN,(check_type)pcVar54,(size_t)&local_790,0x239);
    boost::detail::shared_count::~shared_count(&sStack_298);
    local_7a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_798 = "";
    local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x23a;
    file_06.m_begin = (iterator)&local_7a0;
    msg_06.m_end = pvVar35;
    msg_06.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_7b0,
               msg_06);
    local_a18.px = (element_type *)(local_a18._1_8_ << 8);
    local_a20 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01388f08;
    local_a18.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a08.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xf4aea1;
    if (*(char *)&cVar23._M_node[8]._M_right == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    local_508 = (_Storage<CFeeRate,_true>)&cVar23._M_node[7]._M_right;
    auVar44 = *(undefined1 (*) [16])((long)local_640 + 0x69);
    auVar49[0] = -(*(char *)&cVar23._M_node[7]._M_right == *(char *)((long)local_640 + 0x59));
    auVar49[1] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 1) ==
                  *(char *)((long)local_640 + 0x5a));
    auVar49[2] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 2) ==
                  *(char *)((long)local_640 + 0x5b));
    auVar49[3] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 3) ==
                  *(char *)((long)local_640 + 0x5c));
    auVar49[4] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 4) ==
                  *(char *)((long)local_640 + 0x5d));
    auVar49[5] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 5) ==
                  *(char *)((long)local_640 + 0x5e));
    auVar49[6] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 6) ==
                  *(char *)((long)local_640 + 0x5f));
    auVar49[7] = -(*(char *)((long)&cVar23._M_node[7]._M_right + 7) ==
                  *(char *)((long)local_640 + 0x60));
    auVar49[8] = -((char)cVar23._M_node[8]._M_color == *(char *)((long)local_640 + 0x61));
    auVar49[9] = -(*(byte *)((long)&cVar23._M_node[8]._M_color + 1) ==
                  *(byte *)((long)local_640 + 0x62));
    auVar49[10] = -(*(byte *)((long)&cVar23._M_node[8]._M_color + 2) ==
                   *(byte *)((long)local_640 + 99));
    auVar49[0xb] = -(*(byte *)((long)&cVar23._M_node[8]._M_color + 3) ==
                    *(byte *)((long)local_640 + 100));
    auVar49[0xc] = -(cVar23._M_node[8].field_0x4 == *(char *)((long)local_640 + 0x65));
    auVar49[0xd] = -(cVar23._M_node[8].field_0x5 == *(char *)((long)local_640 + 0x66));
    auVar49[0xe] = -(cVar23._M_node[8].field_0x6 == *(char *)((long)local_640 + 0x67));
    auVar49[0xf] = -(cVar23._M_node[8].field_0x7 == *(char *)((long)local_640 + 0x68));
    auVar40[0] = -(*(char *)&cVar23._M_node[8]._M_parent == auVar44[0]);
    auVar40[1] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 1) == auVar44[1]);
    auVar40[2] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 2) == auVar44[2]);
    auVar40[3] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 3) == auVar44[3]);
    auVar40[4] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 4) == auVar44[4]);
    auVar40[5] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 5) == auVar44[5]);
    auVar40[6] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 6) == auVar44[6]);
    auVar40[7] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 7) == auVar44[7]);
    auVar40[8] = -(*(char *)&cVar23._M_node[8]._M_left == auVar44[8]);
    auVar40[9] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 1) == auVar44[9]);
    auVar40[10] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 2) == auVar44[10]);
    auVar40[0xb] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 3) == auVar44[0xb]);
    auVar40[0xc] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 4) == auVar44[0xc]);
    auVar40[0xd] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 5) == auVar44[0xd]);
    auVar40[0xe] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 6) == auVar44[0xe]);
    auVar40[0xf] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 7) == auVar44[0xf]);
    auVar40 = auVar40 & auVar49;
    local_a88[0] = (ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff;
    local_4a8[0] = (_Storage<CFeeRate,_true>)((long)local_640 + 0x59);
    local_a88._8_8_ = (element_type *)0x0;
    sStack_a78.pi_ = (sp_counted_base *)0x0;
    local_480 = (_Storage<CFeeRate,_true>)0xf43837;
    peStack_478 = (element_type *)0xf4389f;
    local_210._8_8_ = local_210._9_8_ << 8;
    local_210._0_8_ = &PTR__lazy_ostream_0138e0a0;
    sStack_200.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f8 = (undefined1  [8])local_4a8;
    local_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_508;
    local_2a8._8_8_ = local_2a8._9_8_ << 8;
    local_2a8._0_8_ = &PTR__lazy_ostream_01389a00;
    sStack_298.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pcVar56 = "it_child2->second.m_other_wtxid.value()";
    pcVar54 = "ptx_child1->GetWitnessHash()";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_a88,(lazy_ostream *)&local_a20._M_value,1,2,REQUIRE,
               0xf44f0e,(size_t)&local_480,0x23a,(int)__a._M_a);
    boost::detail::shared_count::~shared_count((shared_count *)(local_a88 + 0x10));
  }
  if (aStack_1a0._M_local_buf[8] == '\x01') {
    aStack_1a0._8_8_ = aStack_1a0._8_8_ & 0xffffffffffffff00;
    if (local_1b8 != (_Storage<CFeeRate,_true>)&local_1a8) {
      operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8.pi_)->_vptr_sp_counted_base + 1));
    }
  }
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  poVar36 = (optional<CFeeRate> *)local_210;
  auVar11[0xf] = 0;
  auVar11._0_15_ = stack0xfffffffffffffdf9;
  stack0xfffffffffffffdf8 = auVar11 << 8;
  ProcessNewPackage((PackageMempoolAcceptResult *)&local_1b8._M_value,pCVar19,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(Package *)&local_ac0,
                    false,poVar36);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_210,(Package *)&local_ac0,(PackageMempoolAcceptResult *)&local_1b8._M_value,
             true,pCVar34);
  if (local_1f0 == true) {
    local_7c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7b8 = "";
    local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x242;
    file_07.m_begin = (iterator)&local_7c0;
    msg_07.m_end = (iterator)poVar36;
    msg_07.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_7d0,
               msg_07);
    local_a20 = (_Storage<CFeeRate,_true>)((ulong)local_a20 & 0xffffffffffffff00);
    local_a18.px = (element_type *)0x0;
    local_a18.pn.pi_ = (sp_counted_base *)0x0;
    if (local_1f0 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    local_2a8._8_8_ = local_2a8._9_8_ << 8;
    local_2a8._0_8_ = &PTR__lazy_ostream_01388e08;
    sStack_298.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_7e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7d8 = "";
    local_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_210;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a20._M_value,(lazy_ostream *)local_2a8,1,1,WARN,
               (check_type)pcVar54,(size_t)&local_7e0,0x242);
  }
  else {
    cVar22 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_170,(key_type *)((long)local_578 + 0x59));
    cVar23 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_170,(key_type *)((long)local_640 + 0x59));
    local_7f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7e8 = "";
    local_800 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x246;
    file_08.m_begin = (iterator)&local_7f0;
    msg_08.m_end = (iterator)poVar36;
    msg_08.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_800,
               msg_08);
    local_a18.px = (element_type *)0x0;
    local_a18.pn.pi_ = (sp_counted_base *)0x0;
    local_a88._0_8_ =
         "it_parent_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY";
    local_a88._8_8_ =
         (long)
         "it_parent_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY" +
         0x55;
    local_2a8._8_8_ = local_2a8._9_8_ << 8;
    local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
    sStack_298.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_a88;
    local_810 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_808 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    local_a20._M_value.nSatoshisPerK._0_1_ = cVar22._M_node[2]._M_color == 2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a20._M_value,(lazy_ostream *)local_2a8,1,0,WARN,
               (check_type)pcVar54,(size_t)&local_810,0x246);
    boost::detail::shared_count::~shared_count(&local_a18.pn);
    local_820 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_818 = "";
    local_830 = &boost::unit_test::basic_cstring<char_const>::null;
    local_828 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x247;
    file_09.m_begin = (iterator)&local_820;
    msg_09.m_end = pvVar35;
    msg_09.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_830,
               msg_09);
    local_a20._M_value.nSatoshisPerK._0_1_ = cVar23._M_node[2]._M_color == 2;
    local_a18.px = (element_type *)0x0;
    local_a18.pn.pi_ = (sp_counted_base *)0x0;
    local_a88._0_8_ =
         "it_child_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY";
    local_a88._8_8_ = (element_type *)0xf44ffd;
    local_2a8._8_8_ = local_2a8._9_8_ << 8;
    local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
    sStack_298.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_a88;
    local_840 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_838 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a20._M_value,(lazy_ostream *)local_2a8,1,0,WARN,
               (check_type)pcVar54,(size_t)&local_840,0x247);
  }
  boost::detail::shared_count::~shared_count(&local_a18.pn);
  if (local_1f0 == true) {
    local_1f0 = false;
    if ((shared_count *)local_210._0_8_ != &sStack_200) {
      operator_delete((void *)local_210._0_8_,(ulong)((long)sStack_200.pi_ + 1));
    }
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&local_170);
  if (paStack_190 != &aStack_180) {
    operator_delete(paStack_190,aStack_180._M_allocated_capacity + 1);
  }
  if (_auStack_1b0 != &aStack_1a0) {
    operator_delete(_auStack_1b0,(ulong)(aStack_1a0._M_allocated_capacity + 1));
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aaStack_120[1]._0_8_ != &local_100) {
    operator_delete((void *)aaStack_120[1]._0_8_,local_100._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._8_8_ != aaStack_120) {
    operator_delete((void *)local_138._8_8_,(ulong)(aaStack_120[0]._M_allocated_capacity + 1));
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_b48._M_value);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)local_3c0);
  if ((undefined1 *)local_3e8._8_8_ != local_3d0) {
    operator_delete((void *)local_3e8._8_8_,local_3d0._0_8_ + 1);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_ != &_Stack_3f0) {
    operator_delete((void *)local_408._8_8_,(long)_Stack_3f0._M_pi + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_ac0);
  GenerateRandomKey(SUB81((CKey *)local_850,0));
  CKey::GetPubKey((CPubKey *)local_138,(CKey *)local_850);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&local_1b8._M_value,(CPubKey *)local_138);
  local_3f8._M_value.nSatoshisPerK._0_4_ = local_1a8.pi_._0_4_;
  local_408._8_8_ = _auStack_1b0;
  local_408._0_8_ = local_1b8;
  local_3c0[0] = '\x05';
  GetScriptForDestination((CScript *)&local_1d8.indirect_contents,(CTxDestination *)local_408);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_408);
  local_860 = (CTransaction *)local_650.pi_;
  local_858 = (_Storage<CFeeRate,_true> *)local_648._M_pi;
  if ((_Storage<CFeeRate,_true> *)local_648._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_870,(CKey *)local_5c0);
  uVar55 = (undefined4)((ulong)__a._M_a >> 0x20);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_230,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_1d8.indirect_contents);
  _cVar57 = 4700000000;
  pvVar33 = local_870;
  pvVar35 = (iterator)0x0;
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x118244f00;
  input_signing_key_00._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_230;
  auVar15._4_8_ = pcVar56;
  auVar15._0_4_ = uVar55;
  auVar15._12_8_ = ar;
  auVar15._20_8_ = in_stack_fffffffffffff200;
  auVar15._28_4_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_860;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)local_210,(TestChain100Setup *)this,input_transaction_00,0,
             (int)pvVar33,input_signing_key_00,(CScript)(auVar15 << 0x20),(CAmount)other,
             SUB81(in_stack_fffffffffffff210,0));
  if (0x1c < local_214) {
    free((void *)local_230._0_8_);
    local_230._0_8_ = (char *)0x0;
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_868._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_868,
               local_868._M_head_impl);
  }
  local_868._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_858 != (_Storage<CFeeRate,_true> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_858->_M_value);
  }
  local_880.pi_ = (sp_counted_base *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_878,(CTransaction **)&local_880,(allocator<CTransaction> *)local_408,
             (CMutableTransaction *)local_210);
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x25a;
  file_10.m_begin = (iterator)&local_890;
  msg_10.m_end = pvVar33;
  msg_10.m_begin = pvVar35;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_8a0,
             msg_10);
  local_138._0_8_ = local_640;
  if ((_Storage<CFeeRate,_true> *)local_638._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_638._M_pi)->_M_use_count = (local_638._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_638._M_pi)->_M_use_count = (local_638._M_pi)->_M_use_count + 1;
    }
  }
  local_128 = (_Storage<CFeeRate,_true>)local_880.pi_;
  local_138._8_8_ = local_638._M_pi;
  aaStack_120[0]._M_allocated_capacity = local_878._M_pi;
  if ((_Storage<CFeeRate,_true> *)local_878._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_878._M_pi)->_M_use_count = (local_878._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_878._M_pi)->_M_use_count = (local_878._M_pi)->_M_use_count + 1;
    }
  }
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_138;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_ac0,__l_03,(allocator_type *)&local_4a8[0]._M_value);
  GetPackageHash((uint256 *)local_408,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_ac0);
  local_2a8._0_8_ = local_650.pi_;
  if ((_Storage<CFeeRate,_true> *)local_648._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
    }
  }
  sStack_298.pi_ = local_880.pi_;
  local_2a8._8_8_ = local_648._M_pi;
  local_290.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_878._M_pi;
  if ((_Storage<CFeeRate,_true> *)local_878._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_878._M_pi)->_M_use_count = (local_878._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_878._M_pi)->_M_use_count = (local_878._M_pi)->_M_use_count + 1;
    }
  }
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_2a8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&local_b48._M_value,__l_04,(allocator_type *)&local_508._M_value);
  GetPackageHash((uint256 *)&local_1b8._M_value,
                 (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&local_b48._M_value);
  auVar45[0] = -(local_1b8._M_value.nSatoshisPerK._0_1_ == local_408[0]);
  auVar45[1] = -(local_1b8._M_value.nSatoshisPerK._1_1_ == local_408[1]);
  auVar45[2] = -(local_1b8._M_value.nSatoshisPerK._2_1_ == local_408[2]);
  auVar45[3] = -(local_1b8._M_value.nSatoshisPerK._3_1_ == local_408[3]);
  auVar45[4] = -(local_1b8._M_value.nSatoshisPerK._4_1_ == local_408[4]);
  auVar45[5] = -(local_1b8._M_value.nSatoshisPerK._5_1_ == local_408[5]);
  auVar45[6] = -(local_1b8._M_value.nSatoshisPerK._6_1_ == local_408[6]);
  auVar45[7] = -(local_1b8._M_value.nSatoshisPerK._7_1_ == local_408[7]);
  auVar45[8] = -(auStack_1b0[0] == local_408[8]);
  auVar45[9] = -(auStack_1b0[1] == local_408[9]);
  auVar45[10] = -(uStack_1ae == local_408[10]);
  auVar45[0xb] = -(uStack_1ad == local_408[0xb]);
  auVar45[0xc] = -(uStack_1ac == local_408[0xc]);
  auVar45[0xd] = -(uStack_1ab == local_408[0xd]);
  auVar45[0xe] = -(uStack_1aa == local_408[0xe]);
  auVar45[0xf] = -(uStack_1a9 == local_408[0xf]);
  auVar50[0] = -((uchar)local_1a8.pi_ == local_3f8._M_value.nSatoshisPerK._0_1_);
  auVar50[1] = -(local_1a8.pi_._1_1_ == local_3f8._M_value.nSatoshisPerK._1_1_);
  auVar50[2] = -(local_1a8.pi_._2_1_ == local_3f8._M_value.nSatoshisPerK._2_1_);
  auVar50[3] = -(local_1a8.pi_._3_1_ == local_3f8._M_value.nSatoshisPerK._3_1_);
  auVar50[4] = -(local_1a8.pi_._4_1_ == local_3f8._M_value.nSatoshisPerK._4_1_);
  auVar50[5] = -(local_1a8.pi_._5_1_ == local_3f8._M_value.nSatoshisPerK._5_1_);
  auVar50[6] = -(local_1a8.pi_._6_1_ == local_3f8._M_value.nSatoshisPerK._6_1_);
  auVar50[7] = -(local_1a8.pi_._7_1_ == local_3f8._M_value.nSatoshisPerK._7_1_);
  auVar50[8] = -(aStack_1a0._M_local_buf[0] == _Stack_3f0._M_pi._0_1_);
  auVar50[9] = -(aStack_1a0._M_local_buf[1] == _Stack_3f0._M_pi._1_1_);
  auVar50[10] = -(aStack_1a0._M_local_buf[2] == _Stack_3f0._M_pi._2_1_);
  auVar50[0xb] = -(aStack_1a0._M_local_buf[3] == _Stack_3f0._M_pi._3_1_);
  auVar50[0xc] = -(aStack_1a0._M_local_buf[4] == _Stack_3f0._M_pi._4_1_);
  auVar50[0xd] = -(aStack_1a0._M_local_buf[5] == _Stack_3f0._M_pi._5_1_);
  auVar50[0xe] = -(aStack_1a0._M_local_buf[6] == _Stack_3f0._M_pi._6_1_);
  auVar50[0xf] = -(aStack_1a0._M_local_buf[7] == _Stack_3f0._M_pi._7_1_);
  auVar45 = auVar45 & auVar50;
  local_a88[0] = (ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff;
  local_a88._8_8_ = (element_type *)0x0;
  sStack_a78.pi_ = (sp_counted_base *)0x0;
  local_480 = (_Storage<CFeeRate,_true>)0xf44ffe;
  peStack_478 = (element_type *)0xf4505a;
  local_a18.px = (element_type *)(local_a18._1_8_ << 8);
  local_a20 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
  local_a18.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a08.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_480;
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8a8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&((_Storage<CFeeRate,_true> *)local_a88)->_M_value,
             (lazy_ostream *)&local_a20._M_value,1,0,WARN,_cVar57,(size_t)&local_8b0,0x25a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_a88 + 0x10));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_b48._M_value);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2c8 + lVar30 + 0x18) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2c8 + lVar30 + 0x18));
    }
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&local_ac0);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_140 + lVar30) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_140 + lVar30));
    }
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  local_408._8_8_ = local_648._M_pi;
  local_408._0_8_ = local_650.pi_;
  if ((_Storage<CFeeRate,_true> *)local_648._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_648._M_pi)->_M_use_count = (local_648._M_pi)->_M_use_count + 1;
    }
  }
  _Stack_3f0._M_pi = local_878._M_pi;
  local_3f8 = (_Storage<CFeeRate,_true>)local_880.pi_;
  if ((_Storage<CFeeRate,_true> *)local_878._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_878._M_pi)->_M_use_count = (local_878._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_878._M_pi)->_M_use_count = (local_878._M_pi)->_M_use_count + 1;
    }
  }
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_408;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_2a8,__l_05,(allocator_type *)local_138);
  lVar30 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_428 + lVar30 + 0x18) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_428 + lVar30 + 0x18));
    }
    uVar18 = (undefined1)in_stack_fffffffffffff210;
    lVar30 = lVar30 + -0x10;
  } while (lVar30 != 0);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  poVar36 = (optional<CFeeRate> *)local_138;
  auVar12[0xf] = 0;
  auVar12._0_15_ = stack0xfffffffffffffed1;
  stack0xfffffffffffffed0 = auVar12 << 8;
  ProcessNewPackage((PackageMempoolAcceptResult *)local_408,pCVar19,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(Package *)local_2a8,
                    false,poVar36);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((_Storage<CFeeRate,_true> *)local_138)->_M_value,(Package *)local_2a8,
             (PackageMempoolAcceptResult *)local_408,true,pCVar34);
  if (aaStack_120[0]._M_local_buf[8] == '\x01') {
    local_8c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8b8 = "";
    local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x261;
    file_11.m_begin = (iterator)&local_8c0;
    msg_11.m_end = (iterator)poVar36;
    msg_11.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_8d0,
               msg_11);
    local_a20 = (_Storage<CFeeRate,_true>)((ulong)local_a20 & 0xffffffffffffff00);
    local_a18.px = (element_type *)0x0;
    local_a18.pn.pi_ = (sp_counted_base *)0x0;
    if (aaStack_120[0]._M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01388e08;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_8e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8d8 = "";
    aStack_1a0._M_allocated_capacity = (size_type)(_Storage<CFeeRate,_true> *)local_138;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a20._M_value,(lazy_ostream *)&local_1b8._M_value,1,1,WARN,
               _cVar57,(size_t)&local_8e0,0x261);
    boost::detail::shared_count::~shared_count(&local_a18.pn);
  }
  else {
    cVar22 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)local_3c0,(key_type *)((long)&local_650.pi_[5].use_count_ + 1));
    cVar23 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)local_3c0,(key_type *)((long)&local_880.pi_[5].use_count_ + 1));
    local_8f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_8e8 = "";
    local_900 = &boost::unit_test::basic_cstring<char_const>::null;
    local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x265;
    file_12.m_begin = (iterator)&local_8f0;
    msg_12.m_end = (iterator)poVar36;
    msg_12.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_900,
               msg_12);
    local_a18.px = (element_type *)0x0;
    local_a18.pn.pi_ = (sp_counted_base *)0x0;
    local_a88._0_8_ =
         "it_child2_ignored->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS"
    ;
    local_a88._8_8_ =
         (long)
         "it_child2_ignored->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS"
         + 0x5d;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_910 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_908 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)(_Storage<CFeeRate,_true> *)local_a88;
    local_a20._M_value.nSatoshisPerK._0_1_ = cVar22._M_node[2]._M_color == 3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a20._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               _cVar57,(size_t)&local_910,0x265);
    boost::detail::shared_count::~shared_count(&local_a18.pn);
    local_920 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_918 = "";
    local_930 = &boost::unit_test::basic_cstring<char_const>::null;
    local_928 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x266;
    file_13.m_begin = (iterator)&local_920;
    msg_13.m_end = pvVar35;
    msg_13.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_930,
               msg_13);
    local_a20._M_value.nSatoshisPerK._0_1_ = cVar23._M_node[2]._M_color == _S_red;
    local_a18.px = (element_type *)0x0;
    local_a18.pn.pi_ = (sp_counted_base *)0x0;
    local_a88._0_8_ =
         "it_grandchild->second.m_result_type == MempoolAcceptResult::ResultType::VALID";
    local_a88._8_8_ = (element_type *)0xf45106;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_940 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_938 = "";
    aStack_1a0._M_allocated_capacity = (size_type)(_Storage<CFeeRate,_true> *)local_a88;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_a20._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               _cVar57,(size_t)&local_940,0x266);
    boost::detail::shared_count::~shared_count(&local_a18.pn);
  }
  if (aaStack_120[0]._M_local_buf[8] == '\x01') {
    aaStack_120[0]._8_4_ = aaStack_120[0]._8_4_ & 0xffffff00;
    if ((_Storage<CFeeRate,_true> *)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)((long)local_128 + 1));
    }
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)local_3c0);
  if ((undefined1 *)local_3e8._8_8_ != local_3d0) {
    operator_delete((void *)local_3e8._8_8_,local_3d0._0_8_ + 1);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_ != &_Stack_3f0) {
    operator_delete((void *)local_408._8_8_,(long)_Stack_3f0._M_pi + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_2a8);
  local_958 = (undefined1  [16])0x0;
  local_948 = (pointer)0x0;
  _local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_138[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408,(iterator)local_408,
             local_138);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408);
  if (0x1c < (uint)_Stack_3f0._M_pi._4_4_) {
    free((void *)local_408._0_8_);
  }
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)local_138,(CScript *)&local_250.indirect_contents);
  _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aaStack_120[0]._0_8_;
  local_3f8 = local_128;
  local_408._0_8_ = local_138._0_8_;
  local_408._8_8_ = local_138._8_8_;
  local_3c0[0] = '\x04';
  GetScriptForDestination((CScript *)&local_270.indirect_contents,(CTxDestination *)local_408);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_408);
  local_978.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_978.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408._0_8_ = &local_250;
  if (0x1c < local_234) {
    local_408._0_8_ = local_250.indirect_contents.indirect;
  }
  local_978.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar27 = local_234 - 0x1d;
  if (0x1c >= local_234) {
    uVar27 = local_234;
  }
  local_138._0_8_ =
       (long)&((CScriptBase *)
              &((anon_struct_12_2_7229fdc5_for_indirect_contents *)local_408._0_8_)->indirect)->
              _union + (long)(int)uVar27;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_978,(iterator *)local_408,(iterator *)local_138);
  psVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_988 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_980 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_980->_M_use_count = local_980->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_980->_M_use_count = local_980->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_998,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2c8,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_270.indirect_contents);
  input_signing_key_01.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_01._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_2c8;
  output_destination.super_CScriptBase._union._4_4_ = uVar55;
  output_destination.super_CScriptBase._union._0_4_ = 1;
  output_destination.super_CScriptBase._union._8_8_ = pcVar56;
  output_destination.super_CScriptBase._union._16_8_ = ar;
  output_destination.super_CScriptBase._24_8_ = in_stack_fffffffffffff200;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_988;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)local_2a8,(TestChain100Setup *)this,input_transaction_01,0,
             (int)local_998,input_signing_key_01,output_destination,(CAmount)other,(bool)uVar18);
  if (0x1c < local_2ac) {
    free((void *)local_2c8._0_8_);
    local_2c8._0_8_ = (char *)0x0;
  }
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_990._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_990,
               local_990._M_head_impl);
  }
  local_990._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_980);
  }
  local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&local_9a8,(allocator<CTransaction> *)local_408,
             (CMutableTransaction *)local_2a8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_958,&local_9a8);
  _local_3f8 = (undefined1  [16])0x0;
  local_408 = (undefined1  [16])0x0;
  local_138[0] = (class_property<bool>)0x75;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408,(iterator)local_408,
             local_138);
  uVar4 = _Stack_3f0._M_pi._4_4_ - 0x1d;
  if ((uint)_Stack_3f0._M_pi._4_4_ < 0x1d) {
    uVar4 = _Stack_3f0._M_pi._4_4_;
  }
  ppVar31 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408._0_8_;
  if ((uint)_Stack_3f0._M_pi._4_4_ < 0x1d) {
    ppVar31 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408;
  }
  local_138[0] = 'Q';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408,
             (uchar *)((long)&ppVar31->_union + (long)(int)uVar4),local_138);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_2e8.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_408);
  if (0x1c < (uint)_Stack_3f0._M_pi._4_4_) {
    free((void *)local_408._0_8_);
  }
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)local_138,(CScript *)&local_2e8.indirect_contents);
  _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aaStack_120[0]._0_8_;
  local_3f8 = local_128;
  local_408._8_8_ = local_138._8_8_;
  local_408._0_8_ = local_138._0_8_;
  local_3c0[0] = '\x04';
  GetScriptForDestination((CScript *)&local_308.indirect_contents,(CTxDestination *)local_408);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_408);
  local_9c8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9c8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9c8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._0_4_ = 1;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&local_9c8,(int *)local_408);
  uVar29 = local_2e8.indirect_contents.indirect;
  if (local_2cc < 0x1d) {
    uVar29 = &local_2e8;
  }
  local_408._0_8_ = uVar29;
  uVar27 = local_2cc - 0x1d;
  if (local_2cc < 0x1d) {
    uVar27 = local_2cc;
  }
  local_138._0_8_ =
       (long)&((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar29)->indirect
              )->_union + (long)(int)uVar27;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_9c8,(iterator *)local_408,(iterator *)local_138);
  local_9e8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_9e8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._0_4_ = 2;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::emplace_back<int>(&local_9e8,(int *)local_408);
  uVar29 = &local_2e8;
  if (0x1c < local_2cc) {
    uVar29 = local_2e8.indirect_contents.indirect;
  }
  local_408._0_8_ = uVar29;
  uVar27 = local_2cc - 0x1d;
  if (0x1c >= local_2cc) {
    uVar27 = local_2cc;
  }
  local_138._0_8_ =
       (long)&((CScriptBase *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar29)->indirect
              )->_union + (long)(int)uVar27;
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::
  emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_9e8,(iterator *)local_408,(iterator *)local_138);
  psVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a30 = psVar3[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a28 = psVar3[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_a28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a28->_M_use_count = local_a28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a28->_M_use_count = local_a28->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_a40,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_328.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_308.indirect_contents);
  _cVar57 = 4900000000;
  pvVar33 = local_a40;
  pvVar35 = (iterator)0x0;
  input_signing_key_02.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key_02._0_8_ = &local_328;
  output_destination_00.super_CScriptBase._union._4_4_ = uVar55;
  output_destination_00.super_CScriptBase._union._0_4_ = 1;
  output_destination_00.super_CScriptBase._union._8_8_ = pcVar56;
  output_destination_00.super_CScriptBase._union._16_8_ = ar;
  output_destination_00.super_CScriptBase._24_8_ = in_stack_fffffffffffff200;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_a30;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&local_a20._M_value,(TestChain100Setup *)this,
             input_transaction_02,0,(int)pvVar33,input_signing_key_02,output_destination_00,
             (CAmount)other,(bool)uVar18);
  if (0x1c < local_30c) {
    free(local_328.indirect_contents.indirect);
    local_328.indirect_contents.indirect = (char *)0x0;
  }
  if (local_a38._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_a38,
               local_a38._M_head_impl);
  }
  local_a38._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_a28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a28);
  }
  local_a50 = (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_a48,&local_a50,(allocator<CTransaction> *)local_408,
             (CMutableTransaction *)&local_a20._M_value);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_a88);
  local_a58 = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a88,1);
  uVar5 = local_a88._0_8_;
  uVar29 = *(undefined8 *)(local_a50->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((local_a50->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  p_Var8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((local_a50->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  (((pointer)(local_a88._0_8_ + 0x10))->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       *(element_type **)((local_a50->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a88._0_8_ + 0x18))->_M_pi = p_Var8;
  *(undefined8 *)local_a88._0_8_ = uVar29;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a88._0_8_ + 8))->_M_pi = p_Var7;
  *(undefined4 *)
   &(((pointer)(local_a88._0_8_ + 0x20))->
    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 0;
  p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a88._0_8_ + 0x28);
  if (0x1c < *(uint *)(local_a88._0_8_ + 0x44)) {
    free(p_Var2->_M_pi);
  }
  *(undefined1 (*) [16])(uVar5 + 0x38) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])p_Var2 = (undefined1  [16])0x0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)(local_a88._0_8_ + 0x50),&local_9c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_a70,1);
  (local_a70.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 4800000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             ((long)local_a70.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 8),
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_270.indirect_contents);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector
            (&local_ac0.vin,(vector<CTxIn,_std::allocator<CTxIn>_> *)local_a88);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_ac0.vout,&local_a70);
  local_ac0.nLockTime = uStack_a54;
  local_ac0.version = local_a58;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&((local_ac0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&local_9e8);
  local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&local_ad0,(allocator<CTransaction> *)local_408,
             (CMutableTransaction *)local_a88);
  local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&local_ae0,(allocator<CTransaction> *)local_408,
             &local_ac0);
  ChainstateManager::ProcessTransaction
            ((MempoolAcceptResult *)local_408,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_ae0,false);
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x29f;
  file_14.m_begin = (iterator)&local_af0;
  msg_14.m_end = pvVar33;
  msg_14.m_begin = pvVar35;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b00,
             msg_14);
  local_1b8._M_value.nSatoshisPerK._0_1_ = local_408._0_4_ == 0;
  _auStack_1b0 = (undefined1  [16])0x0;
  local_b48 = (_Storage<CFeeRate,_true>)0xf45107;
  local_b40 = "";
  local_138._8_8_ = local_138._9_8_ << 8;
  local_138._0_8_ = &PTR__lazy_ostream_01389048;
  local_128 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::inst;
  aaStack_120[0]._0_8_ = &local_b48;
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b08 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1b8._M_value,(lazy_ostream *)local_138,1,0,WARN,_cVar57,
             (size_t)&local_b10,0x29f);
  boost::detail::shared_count::~shared_count(&local_1a8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_958,&local_ad0);
  psVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b58 = psVar3[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b50 = psVar3[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_b50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b50->_M_use_count = local_b50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b50->_M_use_count = local_b50->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_b68,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_270.indirect_contents);
  _cVar57 = 0x12a05f138;
  pvVar33 = local_b68;
  pvVar35 = (iterator)0x0;
  input_signing_key_03.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f138;
  input_signing_key_03._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_428;
  auVar16._4_8_ = pcVar56;
  auVar16._0_4_ = uVar55;
  auVar16._12_8_ = ar;
  auVar16._20_8_ = in_stack_fffffffffffff200;
  auVar16._28_4_ = 0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_b58;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&local_b48._M_value,(TestChain100Setup *)this,
             input_transaction_03,0,(int)pvVar33,input_signing_key_03,(CScript)(auVar16 << 0x20),
             (CAmount)other,(bool)uVar18);
  if (0x1c < local_40c) {
    free((void *)local_428._0_8_);
    local_428._0_8_ = (char *)0x0;
  }
  if (local_b60._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_b60,
               local_b60._M_head_impl);
  }
  local_b60._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_b50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b50);
  }
  local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&local_b78,(allocator<CTransaction> *)local_138,
             (CMutableTransaction *)&local_b48._M_value);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_958,&local_b78);
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x2a9;
  file_15.m_begin = (iterator)&local_b88;
  msg_15.m_end = pvVar33;
  msg_15.m_begin = pvVar35;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b98,
             msg_15);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  local_4a8[0]._M_value = CTxMemPool::GetMinFee(pCVar34,(pCVar34->m_opts).max_size_bytes);
  iVar20 = GetVirtualTransactionSize
                     (local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0,0);
  CVar21 = CFeeRate::GetFee(&local_4a8[0]._M_value,(uint32_t)iVar20);
  _auStack_1b0 = (undefined1  [16])0x0;
  local_480 = (_Storage<CFeeRate,_true>)0xf45151;
  peStack_478 = (element_type *)0xf451aa;
  local_138._8_8_ = local_138._9_8_ << 8;
  local_138._0_8_ = &PTR__lazy_ostream_01389048;
  local_128 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::inst;
  aaStack_120[0]._0_8_ = &local_480;
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_ba0 = "";
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  local_1b8._M_value.nSatoshisPerK._0_1_ = 200 < CVar21;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1b8._M_value,(lazy_ostream *)local_138,1,0,WARN,_cVar57,
             (size_t)&local_ba8,0x2a9);
  boost::detail::shared_count::~shared_count(&local_1a8);
  local_bb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_bb0 = "";
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x2aa;
  file_16.m_begin = (iterator)&local_bb8;
  msg_16.m_end = pvVar35;
  msg_16.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_bc8,
             msg_16);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  iVar20 = GetVirtualTransactionSize
                     (local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0,0);
  CVar21 = CFeeRate::GetFee(&(pCVar34->m_opts).min_relay_feerate,(uint32_t)iVar20);
  local_1b8._M_value.nSatoshisPerK._0_1_ = CVar21 < 0xc9;
  _auStack_1b0 = (undefined1  [16])0x0;
  local_480 = (_Storage<CFeeRate,_true>)0xf451ab;
  peStack_478 = (element_type *)0xf45212;
  local_138._8_8_ = local_138._9_8_ << 8;
  local_138._0_8_ = &PTR__lazy_ostream_01389048;
  local_128 = (_Storage<CFeeRate,_true>)boost::unit_test::lazy_ostream::inst;
  aaStack_120[0]._0_8_ = &local_480;
  local_bd8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_bd0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1b8._M_value,(lazy_ostream *)local_138,1,0,WARN,_cVar57,
             (size_t)&local_bd8,0x2aa);
  boost::detail::shared_count::~shared_count(&local_1a8);
  GenerateRandomKey(SUB81((CKey *)local_be8,0));
  CKey::GetPubKey((CPubKey *)&local_1b8._M_value,(CKey *)local_be8);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)&local_480._M_value,(CPubKey *)&local_1b8._M_value);
  local_128._M_value.nSatoshisPerK._0_4_ = local_470;
  local_138._0_8_ = local_480;
  local_138._8_8_ = peStack_478;
  local_f0._M_impl._0_1_ = '\x05';
  GetScriptForDestination((CScript *)&local_448.indirect_contents,(CTxDestination *)local_138);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_138);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&local_480._M_value);
  local_138._0_8_ =
       *(undefined8 *)
        ((local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
        ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_138._8_8_ =
       *(undefined8 *)
        (((local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_128 = *(_Storage<CFeeRate,_true> *)
               (((local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  aaStack_120[0]._0_8_ =
       *(undefined8 *)
        (((local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  aaStack_120[0]._8_1_ = '\0';
  aaStack_120[0]._9_1_ = '\0';
  aaStack_120[0]._10_1_ = '\0';
  aaStack_120[0]._11_1_ = '\0';
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_480._M_value,(COutPoint *)local_138);
  local_138._0_8_ =
       *(undefined8 *)
        ((local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
        ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_138._8_8_ =
       *(undefined8 *)
        (((local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_128 = *(_Storage<CFeeRate,_true> *)
               (((local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  aaStack_120[0]._0_8_ =
       *(undefined8 *)
        (((local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  aaStack_120[0]._8_1_ = '\0';
  aaStack_120[0]._9_1_ = '\0';
  aaStack_120[0]._10_1_ = '\0';
  aaStack_120[0]._11_1_ = '\0';
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_480._M_value,(COutPoint *)local_138);
  local_138._0_8_ =
       *(undefined8 *)
        ((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->hash
        ).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  unique0x10003b9d =
       *(undefined1 (*) [16])
        (((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  aaStack_120[0]._0_8_ =
       *(undefined8 *)
        (((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  aaStack_120[0]._8_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_480._M_value,(COutPoint *)local_138);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)((long)local_480 + 0x50),&local_978);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)((long)local_480 + 0xb8),&local_978);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)((long)local_480 + 0x120),&local_978);
  local_138._0_8_ = (_Storage<CFeeRate,_true>)0x3663a5200;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&local_468,(long *)local_138,
             (CScript *)&local_448.indirect_contents);
  local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (CTransaction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&local_bf8,(allocator<CTransaction> *)local_138,
             (CMutableTransaction *)&local_480._M_value);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_958,&local_bf8);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  p_Var37 = &local_1b8;
  auVar13[0xf] = 0;
  auVar13._0_15_ = stack0xfffffffffffffe51;
  _auStack_1b0 = auVar13 << 8;
  ProcessNewPackage((PackageMempoolAcceptResult *)local_138,pCVar19,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(Package *)local_958,
                    false,(optional<CFeeRate> *)&p_Var37->_M_value);
  pCVar34 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4a8[0]._M_value,(Package *)local_958,(PackageMempoolAcceptResult *)local_138,
             true,pCVar34);
  if (local_488 == '\x01') {
    local_c08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c00 = "";
    local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
    file_17.m_end = (iterator)0x2c3;
    file_17.m_begin = (iterator)&local_c08;
    msg_17.m_end = (iterator)p_Var37;
    msg_17.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_c18,
               msg_17);
    local_508 = (_Storage<CFeeRate,_true>)((ulong)local_508 & 0xffffffffffffff00);
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    if (local_488 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01388e08;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c20 = "";
    aStack_1a0._M_allocated_capacity = (size_type)local_4a8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,1,WARN,
               _cVar57,(size_t)&local_c28,0x2c3);
    boost::detail::shared_count::~shared_count(&local_500.pn);
  }
  else {
    cVar22 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_f0,
                    &((local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    cVar23 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_f0,
                    &((local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    cVar24 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_f0,
                    &((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    cVar25 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&local_f0,
                    &((local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_c38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c30 = "";
    local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
    file_18.m_end = (iterator)0x2ca;
    file_18.m_begin = (iterator)&local_c38;
    msg_18.m_end = (iterator)p_Var37;
    msg_18.m_begin = (iterator)pCVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_c48,
               msg_18);
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    local_d28 = (_Storage<CFeeRate,_true>)0xf45213;
    local_d20.px = (element_type *)0xf45265;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c50 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_d28;
    local_508._M_value.nSatoshisPerK._0_1_ = cVar22._M_node[2]._M_color == 2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               _cVar57,(size_t)&local_c58,0x2ca);
    boost::detail::shared_count::~shared_count(&local_500.pn);
    local_c68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c60 = "";
    local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_19.m_end = (iterator)0x2cb;
    file_19.m_begin = (iterator)&local_c68;
    msg_19.m_end = pvVar35;
    msg_19.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_c78,
               msg_19);
    local_508._M_value.nSatoshisPerK._0_1_ = cVar23._M_node[2]._M_color == 3;
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    local_d28 = (_Storage<CFeeRate,_true>)0xf45266;
    local_d20.px = (element_type *)0xf452bc;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c80 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_d28;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               _cVar57,(size_t)&local_c88,0x2cb);
    boost::detail::shared_count::~shared_count(&local_500.pn);
    local_c98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_c90 = "";
    local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_20.m_end = (iterator)0x2cc;
    file_20.m_begin = (iterator)&local_c98;
    msg_20.m_end = pvVar35;
    msg_20.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_ca8,
               msg_20);
    local_508._M_value.nSatoshisPerK._0_1_ = cVar24._M_node[2]._M_color == _S_red;
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    local_d28 = (_Storage<CFeeRate,_true>)0xf452bd;
    local_d20.px = (element_type *)0xf45307;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_cb8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_cb0 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_d28;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               _cVar57,(size_t)&local_cb8,0x2cc);
    boost::detail::shared_count::~shared_count(&local_500.pn);
    local_cc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_cc0 = "";
    local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_21.m_end = (iterator)0x2cd;
    file_21.m_begin = (iterator)&local_cc8;
    msg_21.m_end = pvVar35;
    msg_21.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_cd8,
               msg_21);
    local_508._M_value.nSatoshisPerK._0_1_ = cVar25._M_node[2]._M_color == _S_red;
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    local_d28 = (_Storage<CFeeRate,_true>)0xf45308;
    local_d20.px = (element_type *)0xf45350;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_ce8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_ce0 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_d28;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               _cVar57,(size_t)&local_ce8,0x2cd);
    boost::detail::shared_count::~shared_count(&local_500.pn);
    local_cf8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_cf0 = "";
    local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
    file_22.m_end = (iterator)0x2ce;
    file_22.m_begin = (iterator)&local_cf8;
    msg_22.m_end = pvVar35;
    msg_22.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_d08,
               msg_22);
    local_d20.px = (element_type *)(local_d20._1_8_ << 8);
    local_d28 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01388f08;
    local_d20.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_d10 = "";
    if (*(char *)&cVar23._M_node[8]._M_right == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    local_510 = &cVar23._M_node[7]._M_right;
    local_4e8 = (_Storage<CFeeRate,_true>)
                &(local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_witness_hash;
    auVar44 = *(undefined1 (*) [16])
               (((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    auVar51[0] = -(*(uchar *)&cVar23._M_node[7]._M_right ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
    auVar51[1] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 1) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
    auVar51[2] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 2) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
    auVar51[3] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 3) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
    auVar51[4] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 4) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
    auVar51[5] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 5) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
    auVar51[6] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 6) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
    auVar51[7] = -(*(uchar *)((long)&cVar23._M_node[7]._M_right + 7) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
    auVar51[8] = -((char)cVar23._M_node[8]._M_color ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
    auVar51[9] = -(*(byte *)((long)&cVar23._M_node[8]._M_color + 1) ==
                  ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
    auVar51[10] = -(*(byte *)((long)&cVar23._M_node[8]._M_color + 2) ==
                   ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
    auVar51[0xb] = -(*(byte *)((long)&cVar23._M_node[8]._M_color + 3) ==
                    ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar51[0xc] = -(cVar23._M_node[8].field_0x4 ==
                    ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar51[0xd] = -(cVar23._M_node[8].field_0x5 ==
                    ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar51[0xe] = -(cVar23._M_node[8].field_0x6 ==
                    ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar51[0xf] = -(cVar23._M_node[8].field_0x7 ==
                    ((local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar41[0] = -(*(char *)&cVar23._M_node[8]._M_parent == auVar44[0]);
    auVar41[1] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 1) == auVar44[1]);
    auVar41[2] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 2) == auVar44[2]);
    auVar41[3] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 3) == auVar44[3]);
    auVar41[4] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 4) == auVar44[4]);
    auVar41[5] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 5) == auVar44[5]);
    auVar41[6] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 6) == auVar44[6]);
    auVar41[7] = -(*(char *)((long)&cVar23._M_node[8]._M_parent + 7) == auVar44[7]);
    auVar41[8] = -(*(char *)&cVar23._M_node[8]._M_left == auVar44[8]);
    auVar41[9] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 1) == auVar44[9]);
    auVar41[10] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 2) == auVar44[10]);
    auVar41[0xb] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 3) == auVar44[0xb]);
    auVar41[0xc] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 4) == auVar44[0xc]);
    auVar41[0xd] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 5) == auVar44[0xd]);
    auVar41[0xe] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 6) == auVar44[0xe]);
    auVar41[0xf] = -(*(char *)((long)&cVar23._M_node[8]._M_left + 7) == auVar44[0xf]);
    auVar41 = auVar41 & auVar51;
    local_4d0._M_value.nSatoshisPerK._0_1_ =
         (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff;
    local_4c8.px = (element_type *)0x0;
    local_4c8.pn.pi_ = (sp_counted_base *)0x0;
    local_4e0.nSatoshisPerK = 0xf43837;
    local_4d8 = "";
    aStack_1a0._M_allocated_capacity = (size_type)&local_4e8;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_0138e0a0;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_4f0 = &local_510;
    local_500.px = (element_type *)(local_500._1_8_ << 8);
    local_508 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389a00;
    local_500.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pcVar54 = "ptx_parent2_v2->GetWitnessHash()";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_4d0._M_value,(lazy_ostream *)&local_d28._M_value,1,2,
               REQUIRE,0xf45351,(size_t)&local_4e0,0x2ce,(int)&local_1b8,
               "it_parent2->second.m_other_wtxid.value()",&local_508);
    boost::detail::shared_count::~shared_count(&local_4c8.pn);
    local_1b8 = (_Storage<CFeeRate,_true>)0x5f5e100;
    iVar20 = GetVirtualTransactionSize
                       (local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,0,0);
    iVar26 = GetVirtualTransactionSize
                       (local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,0,0);
    CFeeRate::CFeeRate(&local_4e0,(CAmount *)&local_1b8,(int)iVar26 + (int)iVar20);
    local_d38 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d30 = "";
    local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
    file_23.m_end = (iterator)0x2d2;
    file_23.m_begin = (iterator)&local_d38;
    msg_23.m_end = pvVar35;
    msg_23.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_d48,
               msg_23);
    if (*(char *)&cVar24._M_node[6]._M_left == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    local_508._M_value.nSatoshisPerK._0_1_ =
         cVar24._M_node[6]._M_parent == (_Base_ptr)local_4e0.nSatoshisPerK;
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    local_d28 = (_Storage<CFeeRate,_true>)0xf4539b;
    local_d20.px = (element_type *)0xf453dd;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_d58 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d50 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_d28;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               (check_type)pcVar54,(size_t)&local_d58,0x2d2);
    boost::detail::shared_count::~shared_count(&local_500.pn);
    local_d68 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d60 = "";
    local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
    file_24.m_end = (iterator)0x2d3;
    file_24.m_begin = (iterator)&local_d68;
    msg_24.m_end = pvVar35;
    msg_24.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_d78,
               msg_24);
    if (*(char *)&cVar25._M_node[6]._M_left == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    local_508._M_value.nSatoshisPerK._0_1_ =
         cVar25._M_node[6]._M_parent == (_Base_ptr)local_4e0.nSatoshisPerK;
    local_500.px = (element_type *)0x0;
    local_500.pn.pi_ = (sp_counted_base *)0x0;
    local_d28 = (_Storage<CFeeRate,_true>)0xf453de;
    local_d20.px = (element_type *)0xf4541e;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_d88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d80 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_d28;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_508._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               (check_type)pcVar54,(size_t)&local_d88,0x2d3);
    boost::detail::shared_count::~shared_count(&local_500.pn);
    local_1b8 = *(_Storage<CFeeRate,_true> *)
                 ((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    _auStack_1b0 = *(undefined1 (*) [16])
                    (((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    aStack_1a0._M_allocated_capacity =
         *(undefined8 *)
          (((local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    aStack_1a0._8_8_ =
         *(undefined8 *)
          ((local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    paStack_190 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(((local_bf8.
                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_188 = *(undefined8 *)
                 (((local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    aStack_180._M_allocated_capacity =
         *(undefined8 *)
          (((local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    __l_06._M_len = 2;
    __l_06._M_array = (iterator)&local_1b8;
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           &local_508._M_value,__l_06,(allocator_type *)&local_d28._M_value);
    local_d98 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_d90 = "";
    local_da8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_25.m_end = (iterator)0x2d5;
    file_25.m_begin = (iterator)&local_d98;
    msg_25.m_end = pvVar35;
    msg_25.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_da8,
               msg_25);
    if (*(char *)&cVar24._M_node[7]._M_left == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    p_Var28 = cVar24._M_node[6]._M_right;
    if ((long)*(_Base_ptr *)(cVar24._M_node + 7) - (long)p_Var28 ==
        (long)local_500.px - (long)local_508) {
      uVar18 = 1;
      _Var32 = local_508;
      for (; p_Var28 != *(_Base_ptr *)(cVar24._M_node + 7); p_Var28 = p_Var28 + 1) {
        auVar52[0] = -(*(undefined1 *)_Var32 == (char)p_Var28->_M_color);
        auVar52[1] = -(*(byte *)((long)_Var32 + 1) == *(byte *)((long)&p_Var28->_M_color + 1));
        auVar52[2] = -(*(byte *)((long)_Var32 + 2) == *(byte *)((long)&p_Var28->_M_color + 2));
        auVar52[3] = -(*(byte *)((long)_Var32 + 3) == *(byte *)((long)&p_Var28->_M_color + 3));
        auVar52[4] = -(*(char *)((long)_Var32 + 4) == p_Var28->field_0x4);
        auVar52[5] = -(*(char *)((long)_Var32 + 5) == p_Var28->field_0x5);
        auVar52[6] = -(*(char *)((long)_Var32 + 6) == p_Var28->field_0x6);
        auVar52[7] = -(*(char *)((long)_Var32 + 7) == p_Var28->field_0x7);
        auVar52[8] = -(*(char *)((long)_Var32 + 8) == *(char *)&p_Var28->_M_parent);
        auVar52[9] = -(*(char *)((long)_Var32 + 9) == *(char *)((long)&p_Var28->_M_parent + 1));
        auVar52[10] = -(*(char *)((long)_Var32 + 10) == *(char *)((long)&p_Var28->_M_parent + 2));
        auVar52[0xb] = -(*(char *)((long)_Var32 + 0xb) == *(char *)((long)&p_Var28->_M_parent + 3));
        auVar52[0xc] = -(*(char *)((long)_Var32 + 0xc) == *(char *)((long)&p_Var28->_M_parent + 4));
        auVar52[0xd] = -(*(char *)((long)_Var32 + 0xd) == *(char *)((long)&p_Var28->_M_parent + 5));
        auVar52[0xe] = -(*(char *)((long)_Var32 + 0xe) == *(char *)((long)&p_Var28->_M_parent + 6));
        auVar52[0xf] = -(*(char *)((long)_Var32 + 0xf) == *(char *)((long)&p_Var28->_M_parent + 7));
        auVar42[0] = -(*(char *)((long)_Var32 + 0x10) == *(char *)&p_Var28->_M_left);
        auVar42[1] = -(*(char *)((long)_Var32 + 0x11) == *(char *)((long)&p_Var28->_M_left + 1));
        auVar42[2] = -(*(char *)((long)_Var32 + 0x12) == *(char *)((long)&p_Var28->_M_left + 2));
        auVar42[3] = -(*(char *)((long)_Var32 + 0x13) == *(char *)((long)&p_Var28->_M_left + 3));
        auVar42[4] = -(*(char *)((long)_Var32 + 0x14) == *(char *)((long)&p_Var28->_M_left + 4));
        auVar42[5] = -(*(char *)((long)_Var32 + 0x15) == *(char *)((long)&p_Var28->_M_left + 5));
        auVar42[6] = -(*(char *)((long)_Var32 + 0x16) == *(char *)((long)&p_Var28->_M_left + 6));
        auVar42[7] = -(*(char *)((long)_Var32 + 0x17) == *(char *)((long)&p_Var28->_M_left + 7));
        auVar42[8] = -(*(char *)((long)_Var32 + 0x18) == *(char *)&p_Var28->_M_right);
        auVar42[9] = -(*(char *)((long)_Var32 + 0x19) == *(char *)((long)&p_Var28->_M_right + 1));
        auVar42[10] = -(*(char *)((long)_Var32 + 0x1a) == *(char *)((long)&p_Var28->_M_right + 2));
        auVar42[0xb] = -(*(char *)((long)_Var32 + 0x1b) == *(char *)((long)&p_Var28->_M_right + 3));
        auVar42[0xc] = -(*(char *)((long)_Var32 + 0x1c) == *(char *)((long)&p_Var28->_M_right + 4));
        auVar42[0xd] = -(*(char *)((long)_Var32 + 0x1d) == *(char *)((long)&p_Var28->_M_right + 5));
        auVar42[0xe] = -(*(char *)((long)_Var32 + 0x1e) == *(char *)((long)&p_Var28->_M_right + 6));
        auVar42[0xf] = -(*(char *)((long)_Var32 + 0x1f) == *(char *)((long)&p_Var28->_M_right + 7));
        auVar42 = auVar42 & auVar52;
        if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00691c22;
        _Var32 = (_Storage<CFeeRate,_true>)((long)_Var32 + 0x20);
      }
    }
    else {
LAB_00691c22:
      uVar18 = 0;
    }
    local_d28._M_value.nSatoshisPerK._0_1_ = uVar18;
    local_d20.px = (element_type *)0x0;
    local_d20.pn.pi_ = (sp_counted_base *)0x0;
    local_4d0 = (_Storage<CFeeRate,_true>)0xf4541f;
    local_4c8.px = (element_type *)0xf45466;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_db8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_db0 = "";
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x0;
    aStack_1a0._M_allocated_capacity = (size_type)&local_4d0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_d28._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               (check_type)pcVar54,(size_t)&local_db8,0x2d5);
    boost::detail::shared_count::~shared_count(&local_d20.pn);
    local_dc8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_dc0 = "";
    local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_26.m_end = (iterator)0x2d6;
    file_26.m_begin = (iterator)&local_dc8;
    msg_26.m_end = pvVar35;
    msg_26.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_dd8,
               msg_26);
    if (*(char *)&cVar25._M_node[7]._M_left == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00693259;
    }
    p_Var28 = cVar25._M_node[6]._M_right;
    if ((long)*(_Base_ptr *)(cVar25._M_node + 7) - (long)p_Var28 ==
        (long)local_500.px - (long)local_508) {
      uVar18 = 1;
      _Var32 = local_508;
      for (; p_Var28 != *(_Base_ptr *)(cVar25._M_node + 7); p_Var28 = p_Var28 + 1) {
        auVar53[0] = -(*(undefined1 *)_Var32 == (char)p_Var28->_M_color);
        auVar53[1] = -(*(byte *)((long)_Var32 + 1) == *(byte *)((long)&p_Var28->_M_color + 1));
        auVar53[2] = -(*(byte *)((long)_Var32 + 2) == *(byte *)((long)&p_Var28->_M_color + 2));
        auVar53[3] = -(*(byte *)((long)_Var32 + 3) == *(byte *)((long)&p_Var28->_M_color + 3));
        auVar53[4] = -(*(char *)((long)_Var32 + 4) == p_Var28->field_0x4);
        auVar53[5] = -(*(char *)((long)_Var32 + 5) == p_Var28->field_0x5);
        auVar53[6] = -(*(char *)((long)_Var32 + 6) == p_Var28->field_0x6);
        auVar53[7] = -(*(char *)((long)_Var32 + 7) == p_Var28->field_0x7);
        auVar53[8] = -(*(char *)((long)_Var32 + 8) == *(char *)&p_Var28->_M_parent);
        auVar53[9] = -(*(char *)((long)_Var32 + 9) == *(char *)((long)&p_Var28->_M_parent + 1));
        auVar53[10] = -(*(char *)((long)_Var32 + 10) == *(char *)((long)&p_Var28->_M_parent + 2));
        auVar53[0xb] = -(*(char *)((long)_Var32 + 0xb) == *(char *)((long)&p_Var28->_M_parent + 3));
        auVar53[0xc] = -(*(char *)((long)_Var32 + 0xc) == *(char *)((long)&p_Var28->_M_parent + 4));
        auVar53[0xd] = -(*(char *)((long)_Var32 + 0xd) == *(char *)((long)&p_Var28->_M_parent + 5));
        auVar53[0xe] = -(*(char *)((long)_Var32 + 0xe) == *(char *)((long)&p_Var28->_M_parent + 6));
        auVar53[0xf] = -(*(char *)((long)_Var32 + 0xf) == *(char *)((long)&p_Var28->_M_parent + 7));
        auVar43[0] = -(*(char *)((long)_Var32 + 0x10) == *(char *)&p_Var28->_M_left);
        auVar43[1] = -(*(char *)((long)_Var32 + 0x11) == *(char *)((long)&p_Var28->_M_left + 1));
        auVar43[2] = -(*(char *)((long)_Var32 + 0x12) == *(char *)((long)&p_Var28->_M_left + 2));
        auVar43[3] = -(*(char *)((long)_Var32 + 0x13) == *(char *)((long)&p_Var28->_M_left + 3));
        auVar43[4] = -(*(char *)((long)_Var32 + 0x14) == *(char *)((long)&p_Var28->_M_left + 4));
        auVar43[5] = -(*(char *)((long)_Var32 + 0x15) == *(char *)((long)&p_Var28->_M_left + 5));
        auVar43[6] = -(*(char *)((long)_Var32 + 0x16) == *(char *)((long)&p_Var28->_M_left + 6));
        auVar43[7] = -(*(char *)((long)_Var32 + 0x17) == *(char *)((long)&p_Var28->_M_left + 7));
        auVar43[8] = -(*(char *)((long)_Var32 + 0x18) == *(char *)&p_Var28->_M_right);
        auVar43[9] = -(*(char *)((long)_Var32 + 0x19) == *(char *)((long)&p_Var28->_M_right + 1));
        auVar43[10] = -(*(char *)((long)_Var32 + 0x1a) == *(char *)((long)&p_Var28->_M_right + 2));
        auVar43[0xb] = -(*(char *)((long)_Var32 + 0x1b) == *(char *)((long)&p_Var28->_M_right + 3));
        auVar43[0xc] = -(*(char *)((long)_Var32 + 0x1c) == *(char *)((long)&p_Var28->_M_right + 4));
        auVar43[0xd] = -(*(char *)((long)_Var32 + 0x1d) == *(char *)((long)&p_Var28->_M_right + 5));
        auVar43[0xe] = -(*(char *)((long)_Var32 + 0x1e) == *(char *)((long)&p_Var28->_M_right + 6));
        auVar43[0xf] = -(*(char *)((long)_Var32 + 0x1f) == *(char *)((long)&p_Var28->_M_right + 7));
        auVar43 = auVar43 & auVar53;
        if ((ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00691d61;
        _Var32 = (_Storage<CFeeRate,_true>)((long)_Var32 + 0x20);
      }
    }
    else {
LAB_00691d61:
      uVar18 = 0;
    }
    local_d28._M_value.nSatoshisPerK._0_1_ = uVar18;
    local_d20.px = (element_type *)0x0;
    local_d20.pn.pi_ = (sp_counted_base *)0x0;
    local_4d0 = (_Storage<CFeeRate,_true>)0xf45467;
    local_4c8.px = (element_type *)0xf454ac;
    _auStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(auStack_1b0._1_8_ << 8);
    local_1b8 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_01389048;
    local_1a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_de8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_de0 = "";
    aStack_1a0._M_allocated_capacity = (size_type)&local_4d0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_d28._M_value,(lazy_ostream *)&local_1b8._M_value,1,0,WARN,
               (check_type)pcVar54,(size_t)&local_de8,0x2d6);
    boost::detail::shared_count::~shared_count(&local_d20.pn);
    if (local_508 != (_Storage<CFeeRate,_true>)0x0) {
      operator_delete((void *)local_508,(long)local_500.pn.pi_ - (long)local_508);
    }
  }
  if (local_488 == '\x01') {
    local_488 = '\0';
    if (local_4a8[0] != (_Storage<CFeeRate,_true>)local_498) {
      operator_delete((void *)local_4a8[0],local_498[0] + 1);
    }
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aaStack_120[1]._0_8_ != &local_100) {
    operator_delete((void *)aaStack_120[1]._0_8_,local_100._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._8_8_ != aaStack_120) {
    operator_delete((void *)local_138._8_8_,(ulong)(aaStack_120[0]._M_allocated_capacity + 1));
  }
  if (local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bf8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_468);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_480._M_value);
  if (0x1c < local_42c) {
    free(local_448.indirect_contents.indirect);
  }
  if (local_be0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_be0,
               local_be0._M_head_impl);
  }
  if (local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b78.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b30);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_b48._M_value);
  if (local_358 == true) {
    local_358 = false;
    if (local_370._M_value.
        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_370._M_value.
                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_370._M_value.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - local_370._0_8_);
    }
  }
  std::__cxx11::
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)(local_3c0 + 8));
  if ((undefined1 *)local_3d8 != local_3d0 + 8) {
    operator_delete((void *)local_3d8,local_3d0._8_8_ + 1);
  }
  if (local_3f8 != (_Storage<CFeeRate,_true>)&local_3e8) {
    operator_delete((void *)local_3f8,local_3e8._0_8_ + 1);
  }
  if (local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ae0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_ac0.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_ac0.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_a70);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a88);
  if (local_a48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a48._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_a08);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_a20._M_value);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_9e8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_9c8);
  if (0x1c < local_2ec) {
    free(local_308.indirect_contents.indirect);
  }
  if (0x1c < local_2cc) {
    free(local_2e8.indirect_contents.indirect);
  }
  if (local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9a8.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_290);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_2a8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_978);
  if (0x1c < local_254) {
    free(local_270.indirect_contents.indirect);
  }
  if (0x1c < local_234) {
    free(local_250.indirect_contents.indirect);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_958);
  if ((_Storage<CFeeRate,_true> *)local_878._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_878._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_1f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_210);
  if (0x1c < local_1bc) {
    free(local_1d8.indirect_contents.indirect);
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_848._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_848,
               (array<unsigned_char,_32UL> *)
               local_848._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if ((_Storage<CFeeRate,_true> *)local_648._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_648._M_pi);
  }
  if ((_Storage<CFeeRate,_true> *)local_638._M_pi != (_Storage<CFeeRate,_true> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_638._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_630.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_630.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_5f8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_5f8.vin);
  if (0x1c < local_9c) {
    free(local_b8.indirect_contents.indirect);
  }
  if (local_5b8._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_5b8,
               (array<unsigned_char,_32UL> *)
               local_5b8._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_5b0);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_598);
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_548.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_548.vin);
  if (0x1c < local_5c) {
    free(local_78.indirect_contents.indirect);
  }
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_4b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00693259:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_witness_swap_tests)
{
    // Mine blocks to mature coinbases.
    mineBlocks(5);
    MockMempoolMinFee(CFeeRate(5000));
    LOCK(cs_main);

    // Transactions with a same-txid-different-witness transaction in the mempool should be ignored,
    // and the mempool entry's wtxid returned.
    CScript witnessScript = CScript() << OP_DROP << OP_TRUE;
    CScript scriptPubKey = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/scriptPubKey,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef ptx_parent = MakeTransactionRef(mtx_parent);

    // Make two children with the same txid but different witnesses.
    CScriptWitness witness1;
    witness1.stack.emplace_back(1);
    witness1.stack.emplace_back(witnessScript.begin(), witnessScript.end());

    CScriptWitness witness2(witness1);
    witness2.stack.emplace_back(2);
    witness2.stack.emplace_back(witnessScript.begin(), witnessScript.end());

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CMutableTransaction mtx_child1;
    mtx_child1.version = 1;
    mtx_child1.vin.resize(1);
    mtx_child1.vin[0].prevout.hash = ptx_parent->GetHash();
    mtx_child1.vin[0].prevout.n = 0;
    mtx_child1.vin[0].scriptSig = CScript();
    mtx_child1.vin[0].scriptWitness = witness1;
    mtx_child1.vout.resize(1);
    mtx_child1.vout[0].nValue = CAmount(48 * COIN);
    mtx_child1.vout[0].scriptPubKey = child_locking_script;

    CMutableTransaction mtx_child2{mtx_child1};
    mtx_child2.vin[0].scriptWitness = witness2;

    CTransactionRef ptx_child1 = MakeTransactionRef(mtx_child1);
    CTransactionRef ptx_child2 = MakeTransactionRef(mtx_child2);

    // child1 and child2 have the same txid
    BOOST_CHECK_EQUAL(ptx_child1->GetHash(), ptx_child2->GetHash());
    // child1 and child2 have different wtxids
    BOOST_CHECK(ptx_child1->GetWitnessHash() != ptx_child2->GetWitnessHash());
    // Check that they have different package hashes
    BOOST_CHECK(GetPackageHash({ptx_parent, ptx_child1}) != GetPackageHash({ptx_parent, ptx_child2}));

    // Try submitting Package1{parent, child1} and Package2{parent, child2} where the children are
    // same-txid-different-witness.
    {
        Package package_parent_child1{ptx_parent, ptx_child1};
        const auto submit_witness1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                       package_parent_child1, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_witness1{CheckPackageMempoolAcceptResult(package_parent_child1, submit_witness1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_witness1.value());
        }

        // Child2 would have been validated individually.
        Package package_parent_child2{ptx_parent, ptx_child2};
        const auto submit_witness2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                       package_parent_child2, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_witness2{CheckPackageMempoolAcceptResult(package_parent_child2, submit_witness2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_witness2.value());
        } else {
            auto it_parent2_deduped = submit_witness2.m_tx_results.find(ptx_parent->GetWitnessHash());
            auto it_child2 = submit_witness2.m_tx_results.find(ptx_child2->GetWitnessHash());
            BOOST_CHECK(it_parent2_deduped->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK_EQUAL(ptx_child1->GetWitnessHash(), it_child2->second.m_other_wtxid.value());
        }

        // Deduplication should work when wtxid != txid. Submit package with the already-in-mempool
        // transactions again, which should not fail.
        const auto submit_segwit_dedup = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                           package_parent_child1, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_segwit_dedup{CheckPackageMempoolAcceptResult(package_parent_child1, submit_segwit_dedup, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_segwit_dedup.value());
        } else {
            auto it_parent_dup = submit_segwit_dedup.m_tx_results.find(ptx_parent->GetWitnessHash());
            auto it_child_dup = submit_segwit_dedup.m_tx_results.find(ptx_child1->GetWitnessHash());
            BOOST_CHECK(it_parent_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_child_dup->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        }
    }

    // Try submitting Package1{child2, grandchild} where child2 is same-txid-different-witness as
    // the in-mempool transaction, child1. Since child1 exists in the mempool and its outputs are
    // available, child2 should be ignored and grandchild should be accepted.
    //
    // This tests a potential censorship vector in which an attacker broadcasts a competing package
    // where a parent's witness is mutated. The honest package should be accepted despite the fact
    // that we don't allow witness replacement.
    CKey grandchild_key = GenerateRandomKey();
    CScript grandchild_locking_script = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));
    auto mtx_grandchild = CreateValidMempoolTransaction(/*input_transaction=*/ptx_child2, /*input_vout=*/0,
                                                        /*input_height=*/0, /*input_signing_key=*/child_key,
                                                        /*output_destination=*/grandchild_locking_script,
                                                        /*output_amount=*/CAmount(47 * COIN), /*submit=*/false);
    CTransactionRef ptx_grandchild = MakeTransactionRef(mtx_grandchild);
    // Check that they have different package hashes
    BOOST_CHECK(GetPackageHash({ptx_child1, ptx_grandchild}) != GetPackageHash({ptx_child2, ptx_grandchild}));
    // We already submitted child1 above.
    {
        Package package_child2_grandchild{ptx_child2, ptx_grandchild};
        const auto submit_spend_ignored = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                            package_child2_grandchild, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_spend_ignored{CheckPackageMempoolAcceptResult(package_child2_grandchild, submit_spend_ignored, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_spend_ignored.value());
        } else {
            auto it_child2_ignored = submit_spend_ignored.m_tx_results.find(ptx_child2->GetWitnessHash());
            auto it_grandchild = submit_spend_ignored.m_tx_results.find(ptx_grandchild->GetWitnessHash());
            BOOST_CHECK(it_child2_ignored->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK(it_grandchild->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
        }
    }

    // A package Package{parent1, parent2, parent3, child} where the parents are a mixture of
    // identical-tx-in-mempool, same-txid-different-witness-in-mempool, and new transactions.
    Package package_mixed;

    // Give all the parents anyone-can-spend scripts so we don't have to deal with signing the child.
    CScript acs_script = CScript() << OP_TRUE;
    CScript acs_spk = GetScriptForDestination(WitnessV0ScriptHash(acs_script));
    CScriptWitness acs_witness;
    acs_witness.stack.emplace_back(acs_script.begin(), acs_script.end());

    // parent1 will already be in the mempool
    auto mtx_parent1 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[1], /*input_vout=*/0,
                                                     /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                     /*output_destination=*/acs_spk,
                                                     /*output_amount=*/CAmount(49 * COIN), /*submit=*/true);
    CTransactionRef ptx_parent1 = MakeTransactionRef(mtx_parent1);
    package_mixed.push_back(ptx_parent1);

    // parent2 will have a same-txid-different-witness tx already in the mempool
    CScript grandparent2_script = CScript() << OP_DROP << OP_TRUE;
    CScript grandparent2_spk = GetScriptForDestination(WitnessV0ScriptHash(grandparent2_script));
    CScriptWitness parent2_witness1;
    parent2_witness1.stack.emplace_back(1);
    parent2_witness1.stack.emplace_back(grandparent2_script.begin(), grandparent2_script.end());
    CScriptWitness parent2_witness2;
    parent2_witness2.stack.emplace_back(2);
    parent2_witness2.stack.emplace_back(grandparent2_script.begin(), grandparent2_script.end());

    // Create grandparent2 creating an output with multiple spending paths. Submit to mempool.
    auto mtx_grandparent2 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[2], /*input_vout=*/0,
                                                          /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                          /*output_destination=*/grandparent2_spk,
                                                          /*output_amount=*/CAmount(49 * COIN), /*submit=*/true);
    CTransactionRef ptx_grandparent2 = MakeTransactionRef(mtx_grandparent2);

    CMutableTransaction mtx_parent2_v1;
    mtx_parent2_v1.version = 1;
    mtx_parent2_v1.vin.resize(1);
    mtx_parent2_v1.vin[0].prevout.hash = ptx_grandparent2->GetHash();
    mtx_parent2_v1.vin[0].prevout.n = 0;
    mtx_parent2_v1.vin[0].scriptSig = CScript();
    mtx_parent2_v1.vin[0].scriptWitness = parent2_witness1;
    mtx_parent2_v1.vout.resize(1);
    mtx_parent2_v1.vout[0].nValue = CAmount(48 * COIN);
    mtx_parent2_v1.vout[0].scriptPubKey = acs_spk;

    CMutableTransaction mtx_parent2_v2{mtx_parent2_v1};
    mtx_parent2_v2.vin[0].scriptWitness = parent2_witness2;

    CTransactionRef ptx_parent2_v1 = MakeTransactionRef(mtx_parent2_v1);
    CTransactionRef ptx_parent2_v2 = MakeTransactionRef(mtx_parent2_v2);
    // Put parent2_v1 in the package, submit parent2_v2 to the mempool.
    const MempoolAcceptResult parent2_v2_result = m_node.chainman->ProcessTransaction(ptx_parent2_v2);
    BOOST_CHECK(parent2_v2_result.m_result_type == MempoolAcceptResult::ResultType::VALID);
    package_mixed.push_back(ptx_parent2_v1);

    // parent3 will be a new transaction. Put a low feerate to make it invalid on its own.
    auto mtx_parent3 = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[3], /*input_vout=*/0,
                                                     /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                     /*output_destination=*/acs_spk,
                                                     /*output_amount=*/CAmount(50 * COIN - low_fee_amt), /*submit=*/false);
    CTransactionRef ptx_parent3 = MakeTransactionRef(mtx_parent3);
    package_mixed.push_back(ptx_parent3);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*ptx_parent3)) > low_fee_amt);
    BOOST_CHECK(m_node.mempool->m_opts.min_relay_feerate.GetFee(GetVirtualTransactionSize(*ptx_parent3)) <= low_fee_amt);

    // child spends parent1, parent2, and parent3
    CKey mixed_grandchild_key = GenerateRandomKey();
    CScript mixed_child_spk = GetScriptForDestination(WitnessV0KeyHash(mixed_grandchild_key.GetPubKey()));

    CMutableTransaction mtx_mixed_child;
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent1->GetHash(), 0));
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent2_v1->GetHash(), 0));
    mtx_mixed_child.vin.emplace_back(COutPoint(ptx_parent3->GetHash(), 0));
    mtx_mixed_child.vin[0].scriptWitness = acs_witness;
    mtx_mixed_child.vin[1].scriptWitness = acs_witness;
    mtx_mixed_child.vin[2].scriptWitness = acs_witness;
    mtx_mixed_child.vout.emplace_back((48 + 49 + 50 - 1) * COIN, mixed_child_spk);
    CTransactionRef ptx_mixed_child = MakeTransactionRef(mtx_mixed_child);
    package_mixed.push_back(ptx_mixed_child);

    // Submit package:
    // parent1 should be ignored
    // parent2_v1 should be ignored (and v2 wtxid returned)
    // parent3 should be accepted
    // child should be accepted
    {
        const auto mixed_result = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_mixed, false, /*client_maxfeerate=*/{});
        if (auto err_mixed{CheckPackageMempoolAcceptResult(package_mixed, mixed_result, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_mixed.value());
        } else {
            auto it_parent1 = mixed_result.m_tx_results.find(ptx_parent1->GetWitnessHash());
            auto it_parent2 = mixed_result.m_tx_results.find(ptx_parent2_v1->GetWitnessHash());
            auto it_parent3 = mixed_result.m_tx_results.find(ptx_parent3->GetWitnessHash());
            auto it_child = mixed_result.m_tx_results.find(ptx_mixed_child->GetWitnessHash());

            BOOST_CHECK(it_parent1->second.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
            BOOST_CHECK(it_parent2->second.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS);
            BOOST_CHECK(it_parent3->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK_EQUAL(ptx_parent2_v2->GetWitnessHash(), it_parent2->second.m_other_wtxid.value());

            // package feerate should include parent3 and child. It should not include parent1 or parent2_v1.
            const CFeeRate expected_feerate(1 * COIN, GetVirtualTransactionSize(*ptx_parent3) + GetVirtualTransactionSize(*ptx_mixed_child));
            BOOST_CHECK(it_parent3->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({ptx_parent3->GetWitnessHash(), ptx_mixed_child->GetWitnessHash()});
            BOOST_CHECK(it_parent3->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
        }
    }
}